

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

bool embree::avx2::CurveNiMBIntersectorK<4,4>::
     occluded_n<embree::avx2::OrientedCurve1IntersectorK<embree::BezierCurveT,4>,embree::avx2::Occluded1KEpilog1<4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  long lVar1;
  long lVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  Primitive PVar4;
  Geometry *pGVar5;
  __int_type_conflict _Var6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  RTCFilterFunctionN p_Var11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [32];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  int iVar27;
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  uint uVar56;
  uint uVar57;
  ulong uVar58;
  ulong uVar59;
  long lVar60;
  byte bVar61;
  uint uVar62;
  ulong uVar63;
  uint uVar64;
  uint uVar65;
  long lVar66;
  bool bVar67;
  float fVar68;
  float fVar96;
  float fVar97;
  vint4 bi_2;
  float fVar98;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined4 uVar69;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  float fVar70;
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  float fVar99;
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined8 uVar100;
  vint4 bi_1;
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  float fVar122;
  float fVar137;
  float fVar138;
  vint4 bi;
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  float fVar139;
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  float fVar155;
  float fVar156;
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  float fVar157;
  float fVar167;
  float fVar168;
  vint4 ai_2;
  float fVar169;
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [32];
  vint4 ai_1;
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [32];
  vint4 ai;
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [32];
  float fVar204;
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  float fVar220;
  float fVar221;
  float fVar222;
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  float fVar219;
  undefined1 auVar218 [32];
  float fVar223;
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar230 [16];
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  float fVar238;
  float fVar253;
  __m128 a;
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [32];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar282 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  float fVar268;
  float fVar279;
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [32];
  undefined1 auVar288 [32];
  undefined1 auVar289 [32];
  undefined1 auVar290 [64];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [32];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar306 [16];
  undefined1 auVar310 [32];
  undefined1 auVar311 [32];
  float fVar322;
  float fVar323;
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  float fVar324;
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar320 [32];
  undefined1 auVar321 [64];
  vfloat_impl<4> p00;
  vfloat_impl<4> p03;
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  uint mask_stack [4];
  RTCFilterFunctionNArguments args;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  undefined1 local_618 [8];
  undefined8 uStack_610;
  undefined8 uStack_608;
  undefined8 uStack_600;
  undefined1 local_5f8 [8];
  float fStack_5f0;
  float fStack_5ec;
  float local_5e8;
  float fStack_5e4;
  float fStack_5e0;
  float fStack_5dc;
  float local_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  undefined1 local_588 [8];
  undefined8 uStack_580;
  undefined8 uStack_578;
  undefined8 uStack_570;
  undefined1 local_568 [8];
  float fStack_560;
  float fStack_55c;
  undefined1 local_558 [32];
  float local_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float local_528;
  float fStack_524;
  float fStack_520;
  float fStack_51c;
  undefined1 local_498 [8];
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  float fStack_484;
  float fStack_480;
  float fStack_47c;
  float local_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  undefined1 local_458 [16];
  undefined1 (*local_448) [16];
  Primitive *local_440;
  undefined1 local_438 [8];
  float fStack_430;
  float fStack_42c;
  undefined1 local_428 [8];
  float fStack_420;
  float fStack_41c;
  undefined1 local_418 [16];
  undefined1 local_408 [16];
  undefined1 local_3f8 [16];
  undefined1 local_3e8 [16];
  undefined1 local_3d8 [32];
  undefined1 local_3b8 [32];
  uint auStack_398 [4];
  RTCFilterFunctionNArguments local_388;
  undefined1 local_358 [32];
  undefined1 local_338 [8];
  float fStack_330;
  float fStack_32c;
  undefined1 local_328 [16];
  undefined1 local_318 [16];
  undefined1 local_308 [16];
  uint local_2f8;
  uint uStack_2f4;
  uint uStack_2f0;
  uint uStack_2ec;
  uint local_2e8;
  uint uStack_2e4;
  uint uStack_2e0;
  uint uStack_2dc;
  undefined1 local_2d8 [16];
  undefined1 local_2c8 [16];
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [16];
  undefined1 local_298 [16];
  undefined1 local_288 [16];
  undefined1 local_278 [16];
  undefined1 local_268 [16];
  undefined1 local_258 [16];
  undefined1 local_248 [16];
  undefined1 local_238 [16];
  float local_228;
  float fStack_224;
  float fStack_220;
  float fStack_21c;
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float local_208;
  float fStack_204;
  float fStack_200;
  float fStack_1fc;
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  uint uStack_1e8;
  float afStack_1e4 [7];
  RTCHitN local_1c8 [16];
  undefined1 local_1b8 [16];
  undefined4 local_1a8;
  undefined4 uStack_1a4;
  undefined4 uStack_1a0;
  undefined4 uStack_19c;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  undefined1 local_188 [16];
  undefined8 local_178;
  undefined8 uStack_170;
  undefined1 local_168 [16];
  uint local_158;
  uint uStack_154;
  uint uStack_150;
  uint uStack_14c;
  uint uStack_148;
  uint uStack_144;
  uint uStack_140;
  uint uStack_13c;
  undefined1 local_138 [32];
  undefined1 local_118 [32];
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  float fStack_c4;
  float fStack_c0;
  undefined4 uStack_bc;
  undefined1 local_b8 [32];
  undefined1 local_98 [32];
  undefined1 local_78 [32];
  ulong auStack_58 [5];
  undefined1 auVar319 [32];
  
  PVar4 = prim[1];
  uVar58 = (ulong)(byte)PVar4;
  lVar60 = uVar58 * 0x25;
  auVar12 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar12 = vinsertps_avx(auVar12,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar13 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar13 = vinsertps_avx(auVar13,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  fVar68 = *(float *)(prim + lVar60 + 0x12);
  auVar12 = vsubps_avx(auVar12,*(undefined1 (*) [16])(prim + lVar60 + 6));
  auVar282._0_4_ = fVar68 * auVar12._0_4_;
  auVar282._4_4_ = fVar68 * auVar12._4_4_;
  auVar282._8_4_ = fVar68 * auVar12._8_4_;
  auVar282._12_4_ = fVar68 * auVar12._12_4_;
  auVar123._0_4_ = fVar68 * auVar13._0_4_;
  auVar123._4_4_ = fVar68 * auVar13._4_4_;
  auVar123._8_4_ = fVar68 * auVar13._8_4_;
  auVar123._12_4_ = fVar68 * auVar13._12_4_;
  auVar12 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar58 * 4 + 6)));
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar13 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar58 * 5 + 6)));
  auVar13 = vcvtdq2ps_avx(auVar13);
  auVar85 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar58 * 6 + 6)));
  auVar85 = vcvtdq2ps_avx(auVar85);
  auVar15 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar58 * 0xf + 6)));
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar16 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar4 * 0x10 + 6)));
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar17 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar4 * 0x10 + uVar58 + 6)));
  auVar18 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar58 * 0x1a + 6)));
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar142 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar58 * 0x1b + 6)));
  auVar18 = vcvtdq2ps_avx(auVar18);
  auVar189 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar58 * 0x1c + 6)));
  auVar142 = vcvtdq2ps_avx(auVar142);
  auVar189 = vcvtdq2ps_avx(auVar189);
  auVar301._4_4_ = auVar123._0_4_;
  auVar301._0_4_ = auVar123._0_4_;
  auVar301._8_4_ = auVar123._0_4_;
  auVar301._12_4_ = auVar123._0_4_;
  auVar19 = vshufps_avx(auVar123,auVar123,0x55);
  auVar209 = vshufps_avx(auVar123,auVar123,0xaa);
  fVar68 = auVar209._0_4_;
  auVar254._0_4_ = fVar68 * auVar85._0_4_;
  fVar96 = auVar209._4_4_;
  auVar254._4_4_ = fVar96 * auVar85._4_4_;
  fVar97 = auVar209._8_4_;
  auVar254._8_4_ = fVar97 * auVar85._8_4_;
  fVar98 = auVar209._12_4_;
  auVar254._12_4_ = fVar98 * auVar85._12_4_;
  auVar239._0_4_ = auVar17._0_4_ * fVar68;
  auVar239._4_4_ = auVar17._4_4_ * fVar96;
  auVar239._8_4_ = auVar17._8_4_ * fVar97;
  auVar239._12_4_ = auVar17._12_4_ * fVar98;
  auVar224._0_4_ = auVar189._0_4_ * fVar68;
  auVar224._4_4_ = auVar189._4_4_ * fVar96;
  auVar224._8_4_ = auVar189._8_4_ * fVar97;
  auVar224._12_4_ = auVar189._12_4_ * fVar98;
  auVar209 = vfmadd231ps_fma(auVar254,auVar19,auVar13);
  auVar255 = vfmadd231ps_fma(auVar239,auVar19,auVar16);
  auVar19 = vfmadd231ps_fma(auVar224,auVar142,auVar19);
  auVar72 = vfmadd231ps_fma(auVar209,auVar301,auVar12);
  auVar255 = vfmadd231ps_fma(auVar255,auVar301,auVar15);
  auVar73 = vfmadd231ps_fma(auVar19,auVar18,auVar301);
  auVar302._4_4_ = auVar282._0_4_;
  auVar302._0_4_ = auVar282._0_4_;
  auVar302._8_4_ = auVar282._0_4_;
  auVar302._12_4_ = auVar282._0_4_;
  auVar19 = vshufps_avx(auVar282,auVar282,0x55);
  auVar209 = vshufps_avx(auVar282,auVar282,0xaa);
  fVar68 = auVar209._0_4_;
  auVar274._0_4_ = fVar68 * auVar85._0_4_;
  fVar96 = auVar209._4_4_;
  auVar274._4_4_ = fVar96 * auVar85._4_4_;
  fVar97 = auVar209._8_4_;
  auVar274._8_4_ = fVar97 * auVar85._8_4_;
  fVar98 = auVar209._12_4_;
  auVar274._12_4_ = fVar98 * auVar85._12_4_;
  auVar101._0_4_ = auVar17._0_4_ * fVar68;
  auVar101._4_4_ = auVar17._4_4_ * fVar96;
  auVar101._8_4_ = auVar17._8_4_ * fVar97;
  auVar101._12_4_ = auVar17._12_4_ * fVar98;
  auVar71._0_4_ = auVar189._0_4_ * fVar68;
  auVar71._4_4_ = auVar189._4_4_ * fVar96;
  auVar71._8_4_ = auVar189._8_4_ * fVar97;
  auVar71._12_4_ = auVar189._12_4_ * fVar98;
  auVar13 = vfmadd231ps_fma(auVar274,auVar19,auVar13);
  auVar85 = vfmadd231ps_fma(auVar101,auVar19,auVar16);
  auVar16 = vfmadd231ps_fma(auVar71,auVar19,auVar142);
  auVar101 = vfmadd231ps_fma(auVar13,auVar302,auVar12);
  auVar102 = vfmadd231ps_fma(auVar85,auVar302,auVar15);
  auVar312._8_4_ = 0x7fffffff;
  auVar312._0_8_ = 0x7fffffff7fffffff;
  auVar312._12_4_ = 0x7fffffff;
  auVar12 = vandps_avx(auVar72,auVar312);
  auVar205._8_4_ = 0x219392ef;
  auVar205._0_8_ = 0x219392ef219392ef;
  auVar205._12_4_ = 0x219392ef;
  auVar12 = vcmpps_avx(auVar12,auVar205,1);
  auVar13 = vblendvps_avx(auVar72,auVar205,auVar12);
  auVar12 = vandps_avx(auVar255,auVar312);
  auVar12 = vcmpps_avx(auVar12,auVar205,1);
  auVar85 = vblendvps_avx(auVar255,auVar205,auVar12);
  auVar12 = vandps_avx(auVar73,auVar312);
  auVar12 = vcmpps_avx(auVar12,auVar205,1);
  auVar12 = vblendvps_avx(auVar73,auVar205,auVar12);
  auVar103 = vfmadd231ps_fma(auVar16,auVar302,auVar18);
  auVar15 = vrcpps_avx(auVar13);
  auVar206._8_4_ = 0x3f800000;
  auVar206._0_8_ = 0x3f8000003f800000;
  auVar206._12_4_ = 0x3f800000;
  auVar13 = vfnmadd213ps_fma(auVar13,auVar15,auVar206);
  auVar72 = vfmadd132ps_fma(auVar13,auVar15,auVar15);
  auVar13 = vrcpps_avx(auVar85);
  auVar85 = vfnmadd213ps_fma(auVar85,auVar13,auVar206);
  auVar73 = vfmadd132ps_fma(auVar85,auVar13,auVar13);
  auVar13 = vrcpps_avx(auVar12);
  auVar12 = vfnmadd213ps_fma(auVar12,auVar13,auVar206);
  auVar282 = vfmadd132ps_fma(auVar12,auVar13,auVar13);
  fVar68 = (*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar60 + 0x16)) *
           *(float *)(prim + lVar60 + 0x1a);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar58 * 7 + 6);
  auVar12 = vpmovsxwd_avx(auVar12);
  auVar176._4_4_ = fVar68;
  auVar176._0_4_ = fVar68;
  auVar176._8_4_ = fVar68;
  auVar176._12_4_ = fVar68;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar58 * 0xb + 6);
  auVar13 = vpmovsxwd_avx(auVar13);
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar13 = vcvtdq2ps_avx(auVar13);
  auVar13 = vsubps_avx(auVar13,auVar12);
  auVar71 = vfmadd213ps_fma(auVar13,auVar176,auVar12);
  auVar85._8_8_ = 0;
  auVar85._0_8_ = *(ulong *)(prim + uVar58 * 9 + 6);
  auVar12 = vpmovsxwd_avx(auVar85);
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar58 * 0xd + 6);
  auVar13 = vpmovsxwd_avx(auVar15);
  auVar13 = vcvtdq2ps_avx(auVar13);
  auVar13 = vsubps_avx(auVar13,auVar12);
  auVar85 = vfmadd213ps_fma(auVar13,auVar176,auVar12);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar58 * 0x12 + 6);
  auVar12 = vpmovsxwd_avx(auVar16);
  uVar63 = (ulong)(uint)((int)(uVar58 * 5) << 2);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar58 * 2 + uVar63 + 6);
  auVar13 = vpmovsxwd_avx(auVar17);
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar13 = vcvtdq2ps_avx(auVar13);
  auVar13 = vsubps_avx(auVar13,auVar12);
  auVar15 = vfmadd213ps_fma(auVar13,auVar176,auVar12);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar63 + 6);
  auVar12 = vpmovsxwd_avx(auVar18);
  auVar142._8_8_ = 0;
  auVar142._0_8_ = *(ulong *)(prim + uVar58 * 0x18 + 6);
  auVar13 = vpmovsxwd_avx(auVar142);
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar13 = vcvtdq2ps_avx(auVar13);
  auVar13 = vsubps_avx(auVar13,auVar12);
  auVar16 = vfmadd213ps_fma(auVar13,auVar176,auVar12);
  auVar189._8_8_ = 0;
  auVar189._0_8_ = *(ulong *)(prim + uVar58 * 0x1d + 6);
  auVar12 = vpmovsxwd_avx(auVar189);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar58 + (ulong)(byte)PVar4 * 0x20 + 6);
  auVar13 = vpmovsxwd_avx(auVar19);
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar13 = vcvtdq2ps_avx(auVar13);
  auVar13 = vsubps_avx(auVar13,auVar12);
  auVar17 = vfmadd213ps_fma(auVar13,auVar176,auVar12);
  auVar209._8_8_ = 0;
  auVar209._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar4 * 0x20 - uVar58) + 6);
  auVar12 = vpmovsxwd_avx(auVar209);
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar255._8_8_ = 0;
  auVar255._0_8_ = *(ulong *)(prim + uVar58 * 0x23 + 6);
  auVar13 = vpmovsxwd_avx(auVar255);
  auVar13 = vcvtdq2ps_avx(auVar13);
  auVar13 = vsubps_avx(auVar13,auVar12);
  auVar13 = vfmadd213ps_fma(auVar13,auVar176,auVar12);
  auVar12 = vsubps_avx(auVar71,auVar101);
  auVar187._0_4_ = auVar72._0_4_ * auVar12._0_4_;
  auVar187._4_4_ = auVar72._4_4_ * auVar12._4_4_;
  auVar187._8_4_ = auVar72._8_4_ * auVar12._8_4_;
  auVar187._12_4_ = auVar72._12_4_ * auVar12._12_4_;
  auVar12 = vsubps_avx(auVar85,auVar101);
  auVar124._0_4_ = auVar72._0_4_ * auVar12._0_4_;
  auVar124._4_4_ = auVar72._4_4_ * auVar12._4_4_;
  auVar124._8_4_ = auVar72._8_4_ * auVar12._8_4_;
  auVar124._12_4_ = auVar72._12_4_ * auVar12._12_4_;
  auVar12 = vsubps_avx(auVar15,auVar102);
  auVar170._0_4_ = auVar73._0_4_ * auVar12._0_4_;
  auVar170._4_4_ = auVar73._4_4_ * auVar12._4_4_;
  auVar170._8_4_ = auVar73._8_4_ * auVar12._8_4_;
  auVar170._12_4_ = auVar73._12_4_ * auVar12._12_4_;
  auVar12 = vsubps_avx(auVar16,auVar102);
  auVar102._0_4_ = auVar73._0_4_ * auVar12._0_4_;
  auVar102._4_4_ = auVar73._4_4_ * auVar12._4_4_;
  auVar102._8_4_ = auVar73._8_4_ * auVar12._8_4_;
  auVar102._12_4_ = auVar73._12_4_ * auVar12._12_4_;
  auVar12 = vsubps_avx(auVar17,auVar103);
  auVar147._0_4_ = auVar282._0_4_ * auVar12._0_4_;
  auVar147._4_4_ = auVar282._4_4_ * auVar12._4_4_;
  auVar147._8_4_ = auVar282._8_4_ * auVar12._8_4_;
  auVar147._12_4_ = auVar282._12_4_ * auVar12._12_4_;
  auVar12 = vsubps_avx(auVar13,auVar103);
  auVar72._0_4_ = auVar282._0_4_ * auVar12._0_4_;
  auVar72._4_4_ = auVar282._4_4_ * auVar12._4_4_;
  auVar72._8_4_ = auVar282._8_4_ * auVar12._8_4_;
  auVar72._12_4_ = auVar282._12_4_ * auVar12._12_4_;
  auVar12 = vpminsd_avx(auVar187,auVar124);
  auVar13 = vpminsd_avx(auVar170,auVar102);
  auVar12 = vmaxps_avx(auVar12,auVar13);
  auVar13 = vpminsd_avx(auVar147,auVar72);
  uVar69 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar225._4_4_ = uVar69;
  auVar225._0_4_ = uVar69;
  auVar225._8_4_ = uVar69;
  auVar225._12_4_ = uVar69;
  auVar13 = vmaxps_avx(auVar13,auVar225);
  auVar12 = vmaxps_avx(auVar12,auVar13);
  local_2d8._0_4_ = auVar12._0_4_ * 0.99999964;
  local_2d8._4_4_ = auVar12._4_4_ * 0.99999964;
  local_2d8._8_4_ = auVar12._8_4_ * 0.99999964;
  local_2d8._12_4_ = auVar12._12_4_ * 0.99999964;
  auVar12 = vpmaxsd_avx(auVar187,auVar124);
  auVar13 = vpmaxsd_avx(auVar170,auVar102);
  auVar12 = vminps_avx(auVar12,auVar13);
  auVar13 = vpmaxsd_avx(auVar147,auVar72);
  uVar69 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar74._4_4_ = uVar69;
  auVar74._0_4_ = uVar69;
  auVar74._8_4_ = uVar69;
  auVar74._12_4_ = uVar69;
  auVar13 = vminps_avx(auVar13,auVar74);
  auVar12 = vminps_avx(auVar12,auVar13);
  auVar73._0_4_ = auVar12._0_4_ * 1.0000004;
  auVar73._4_4_ = auVar12._4_4_ * 1.0000004;
  auVar73._8_4_ = auVar12._8_4_ * 1.0000004;
  auVar73._12_4_ = auVar12._12_4_ * 1.0000004;
  auVar103._1_3_ = 0;
  auVar103[0] = PVar4;
  auVar103[4] = PVar4;
  auVar103._5_3_ = 0;
  auVar103[8] = PVar4;
  auVar103._9_3_ = 0;
  auVar103[0xc] = PVar4;
  auVar103._13_3_ = 0;
  auVar13 = vpcmpgtd_avx(auVar103,_DAT_01f7fcf0);
  auVar12 = vcmpps_avx(local_2d8,auVar73,2);
  auVar12 = vandps_avx(auVar12,auVar13);
  uVar56 = vmovmskps_avx(auVar12);
  if (uVar56 == 0) {
    uVar58 = 0;
LAB_016b14cc:
    return (bool)((byte)uVar58 & 1);
  }
  uVar56 = uVar56 & 0xff;
  auVar93._16_16_ = mm_lookupmask_ps._240_16_;
  auVar93._0_16_ = mm_lookupmask_ps._240_16_;
  local_138 = vblendps_avx(auVar93,ZEXT832(0) << 0x20,0x80);
  local_448 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
  auVar321 = ZEXT864(0);
  local_440 = prim;
LAB_016af368:
  lVar60 = 0;
  for (uVar58 = (ulong)uVar56; (uVar58 & 1) == 0; uVar58 = uVar58 >> 1 | 0x8000000000000000) {
    lVar60 = lVar60 + 1;
  }
  uVar57 = *(uint *)(local_440 + 2);
  local_2f8 = *(uint *)(local_440 + lVar60 * 4 + 6);
  pGVar5 = (context->scene->geometries).items[uVar57].ptr;
  fVar68 = (pGVar5->time_range).lower;
  fVar68 = pGVar5->fnumTimeSegments *
           ((*(float *)(ray + k * 4 + 0x70) - fVar68) / ((pGVar5->time_range).upper - fVar68));
  auVar12 = vroundss_avx(ZEXT416((uint)fVar68),ZEXT416((uint)fVar68),9);
  auVar12 = vminss_avx(auVar12,ZEXT416((uint)(pGVar5->fnumTimeSegments + -1.0)));
  auVar209 = vmaxss_avx(auVar321._0_16_,auVar12);
  uVar58 = (ulong)*(uint *)(*(long *)&pGVar5->field_0x58 +
                           (ulong)local_2f8 *
                           pGVar5[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  _Var6 = pGVar5[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar66 = (long)(int)auVar209._0_4_ * 0x38;
  lVar7 = *(long *)(_Var6 + lVar66);
  lVar8 = *(long *)(_Var6 + 0x10 + lVar66);
  auVar12 = *(undefined1 (*) [16])(lVar7 + lVar8 * uVar58);
  lVar60 = uVar58 + 1;
  auVar13 = *(undefined1 (*) [16])(lVar7 + lVar8 * lVar60);
  lVar1 = uVar58 + 2;
  auVar85 = *(undefined1 (*) [16])(lVar7 + lVar8 * lVar1);
  lVar2 = uVar58 + 3;
  auVar15 = *(undefined1 (*) [16])(lVar7 + lVar8 * lVar2);
  lVar7 = *(long *)&pGVar5[4].fnumTimeSegments;
  lVar8 = *(long *)(lVar7 + lVar66);
  lVar9 = *(long *)(lVar7 + 0x10 + lVar66);
  auVar16 = *(undefined1 (*) [16])(lVar8 + lVar9 * uVar58);
  auVar17 = *(undefined1 (*) [16])(lVar8 + lVar9 * lVar60);
  auVar18 = *(undefined1 (*) [16])(lVar8 + lVar9 * lVar1);
  auVar142 = *(undefined1 (*) [16])(lVar8 + lVar9 * lVar2);
  auVar255 = ZEXT816(0) << 0x40;
  auVar313._0_4_ = auVar15._0_4_ * 0.0;
  auVar313._4_4_ = auVar15._4_4_ * 0.0;
  auVar313._8_4_ = auVar15._8_4_ * 0.0;
  auVar313._12_4_ = auVar15._12_4_ * 0.0;
  auVar189 = vfmadd231ps_fma(auVar313,auVar85,auVar255);
  auVar73 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar13,auVar189);
  auVar280._8_4_ = 0x40400000;
  auVar280._0_8_ = 0x4040000040400000;
  auVar280._12_4_ = 0x40400000;
  auVar189 = vfmadd231ps_fma(auVar189,auVar13,auVar280);
  auVar147 = vfnmadd231ps_fma(auVar189,auVar12,auVar280);
  auVar207._0_4_ = auVar142._0_4_ * 0.0;
  auVar207._4_4_ = auVar142._4_4_ * 0.0;
  auVar207._8_4_ = auVar142._8_4_ * 0.0;
  auVar207._12_4_ = auVar142._12_4_ * 0.0;
  auVar19 = vfmadd231ps_fma(auVar207,auVar18,auVar255);
  auVar189 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar17,auVar19);
  auVar240._0_4_ = auVar16._0_4_ + auVar189._0_4_;
  auVar240._4_4_ = auVar16._4_4_ + auVar189._4_4_;
  auVar240._8_4_ = auVar16._8_4_ + auVar189._8_4_;
  auVar240._12_4_ = auVar16._12_4_ + auVar189._12_4_;
  auVar189 = vfmadd231ps_fma(auVar19,auVar17,auVar280);
  auVar19 = vfnmadd231ps_fma(auVar189,auVar16,auVar280);
  auVar282 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar85,auVar15);
  auVar140._0_4_ = auVar15._0_4_ * 3.0;
  auVar140._4_4_ = auVar15._4_4_ * 3.0;
  auVar140._8_4_ = auVar15._8_4_ * 3.0;
  auVar140._12_4_ = auVar15._12_4_ * 3.0;
  auVar85 = vfnmadd231ps_fma(auVar140,auVar280,auVar85);
  auVar85 = vfmadd231ps_fma(auVar85,auVar255,auVar13);
  auVar170 = vfnmadd231ps_fma(auVar85,auVar255,auVar12);
  auVar85 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar18,auVar142);
  auVar85 = vfmadd231ps_fma(auVar85,auVar17,auVar255);
  auVar189 = vfmadd231ps_fma(auVar85,auVar16,auVar255);
  auVar226._0_4_ = auVar142._0_4_ * 3.0;
  auVar226._4_4_ = auVar142._4_4_ * 3.0;
  auVar226._8_4_ = auVar142._8_4_ * 3.0;
  auVar226._12_4_ = auVar142._12_4_ * 3.0;
  auVar85 = vfnmadd231ps_fma(auVar226,auVar280,auVar18);
  auVar85 = vfmadd231ps_fma(auVar85,auVar255,auVar17);
  auVar16 = vfnmadd231ps_fma(auVar85,auVar255,auVar16);
  auVar85 = vshufps_avx(auVar147,auVar147,0xc9);
  auVar15 = vshufps_avx(auVar240,auVar240,0xc9);
  fVar99 = auVar147._0_4_;
  auVar188._0_4_ = fVar99 * auVar15._0_4_;
  fVar322 = auVar147._4_4_;
  auVar188._4_4_ = fVar322 * auVar15._4_4_;
  fVar323 = auVar147._8_4_;
  auVar188._8_4_ = fVar323 * auVar15._8_4_;
  fVar324 = auVar147._12_4_;
  auVar188._12_4_ = fVar324 * auVar15._12_4_;
  auVar101 = vfmsub231ps_fma(auVar188,auVar85,auVar240);
  auVar15 = vshufps_avx(auVar19,auVar19,0xc9);
  auVar104._0_4_ = fVar99 * auVar15._0_4_;
  auVar104._4_4_ = fVar322 * auVar15._4_4_;
  auVar104._8_4_ = fVar323 * auVar15._8_4_;
  auVar104._12_4_ = fVar324 * auVar15._12_4_;
  auVar102 = vfmsub231ps_fma(auVar104,auVar85,auVar19);
  auVar85 = vshufps_avx(auVar170,auVar170,0xc9);
  auVar15 = vshufps_avx(auVar189,auVar189,0xc9);
  fVar70 = auVar170._0_4_;
  auVar105._0_4_ = fVar70 * auVar15._0_4_;
  fVar155 = auVar170._4_4_;
  auVar105._4_4_ = fVar155 * auVar15._4_4_;
  fVar156 = auVar170._8_4_;
  auVar105._8_4_ = fVar156 * auVar15._8_4_;
  fVar204 = auVar170._12_4_;
  auVar105._12_4_ = fVar204 * auVar15._12_4_;
  auVar103 = vfmsub231ps_fma(auVar105,auVar85,auVar189);
  auVar15 = vshufps_avx(auVar16,auVar16,0xc9);
  auVar106._0_4_ = fVar70 * auVar15._0_4_;
  auVar106._4_4_ = fVar155 * auVar15._4_4_;
  auVar106._8_4_ = fVar156 * auVar15._8_4_;
  auVar106._12_4_ = fVar204 * auVar15._12_4_;
  auVar123 = vfmsub231ps_fma(auVar106,auVar85,auVar16);
  lVar8 = *(long *)(_Var6 + 0x38 + lVar66);
  lVar9 = *(long *)(_Var6 + 0x48 + lVar66);
  auVar85 = *(undefined1 (*) [16])(lVar8 + lVar9 * lVar60);
  auVar15 = *(undefined1 (*) [16])(lVar8 + lVar9 * lVar1);
  auVar16 = *(undefined1 (*) [16])(lVar8 + lVar9 * lVar2);
  lVar10 = *(long *)(lVar7 + 0x38 + lVar66);
  lVar7 = *(long *)(lVar7 + 0x48 + lVar66);
  auVar227._0_4_ = auVar16._0_4_ * 0.0;
  auVar227._4_4_ = auVar16._4_4_ * 0.0;
  auVar227._8_4_ = auVar16._8_4_ * 0.0;
  auVar227._12_4_ = auVar16._12_4_ * 0.0;
  auVar17 = vfmadd231ps_fma(auVar227,auVar15,auVar255);
  auVar71 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar85,auVar17);
  auVar18 = vfmadd231ps_fma(auVar17,auVar85,auVar280);
  auVar17 = *(undefined1 (*) [16])(lVar8 + lVar9 * uVar58);
  auVar176 = vfnmadd231ps_fma(auVar18,auVar17,auVar280);
  auVar18 = *(undefined1 (*) [16])(lVar10 + lVar1 * lVar7);
  auVar142 = *(undefined1 (*) [16])(lVar10 + lVar7 * lVar2);
  auVar291._0_4_ = auVar142._0_4_ * 0.0;
  auVar291._4_4_ = auVar142._4_4_ * 0.0;
  auVar291._8_4_ = auVar142._8_4_ * 0.0;
  auVar291._12_4_ = auVar142._12_4_ * 0.0;
  auVar72 = vfmadd231ps_fma(auVar291,auVar18,auVar255);
  auVar189 = *(undefined1 (*) [16])(lVar10 + lVar60 * lVar7);
  auVar255 = vfmadd213ps_fma(auVar255,auVar189,auVar72);
  auVar19 = *(undefined1 (*) [16])(lVar10 + uVar58 * lVar7);
  auVar269._0_4_ = auVar255._0_4_ + auVar19._0_4_;
  auVar269._4_4_ = auVar255._4_4_ + auVar19._4_4_;
  auVar269._8_4_ = auVar255._8_4_ + auVar19._8_4_;
  auVar269._12_4_ = auVar255._12_4_ + auVar19._12_4_;
  auVar255 = vshufps_avx(auVar269,auVar269,0xc9);
  fVar219 = auVar176._0_4_;
  auVar256._0_4_ = fVar219 * auVar255._0_4_;
  fVar220 = auVar176._4_4_;
  auVar256._4_4_ = fVar220 * auVar255._4_4_;
  fVar221 = auVar176._8_4_;
  auVar256._8_4_ = fVar221 * auVar255._8_4_;
  fVar222 = auVar176._12_4_;
  auVar256._12_4_ = fVar222 * auVar255._12_4_;
  auVar255 = vshufps_avx(auVar176,auVar176,0xc9);
  auVar274 = vfmsub231ps_fma(auVar256,auVar255,auVar269);
  auVar72 = vfmadd231ps_fma(auVar72,auVar189,auVar280);
  auVar124 = vfnmadd231ps_fma(auVar72,auVar19,auVar280);
  auVar72 = vshufps_avx(auVar124,auVar124,0xc9);
  auVar257._0_4_ = fVar219 * auVar72._0_4_;
  auVar257._4_4_ = fVar220 * auVar72._4_4_;
  auVar257._8_4_ = fVar221 * auVar72._8_4_;
  auVar257._12_4_ = fVar222 * auVar72._12_4_;
  auVar72 = vfmsub231ps_fma(auVar257,auVar255,auVar124);
  auVar255 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar15,auVar16);
  auVar303._0_4_ = auVar16._0_4_ * 3.0;
  auVar303._4_4_ = auVar16._4_4_ * 3.0;
  auVar303._8_4_ = auVar16._8_4_ * 3.0;
  auVar303._12_4_ = auVar16._12_4_ * 3.0;
  auVar124 = vfnmadd231ps_fma(auVar303,auVar280,auVar15);
  auVar15 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar18,auVar142);
  auVar141._0_4_ = auVar142._0_4_ * 3.0;
  auVar141._4_4_ = auVar142._4_4_ * 3.0;
  auVar141._8_4_ = auVar142._8_4_ * 3.0;
  auVar141._12_4_ = auVar142._12_4_ * 3.0;
  auVar16 = vfnmadd231ps_fma(auVar141,auVar280,auVar18);
  auVar74 = ZEXT816(0) << 0x20;
  auVar15 = vfmadd231ps_fma(auVar15,auVar189,auVar74);
  auVar16 = vfmadd231ps_fma(auVar16,auVar74,auVar189);
  auVar18 = vfmadd231ps_fma(auVar15,auVar19,auVar74);
  auVar142 = vfnmadd231ps_fma(auVar16,auVar74,auVar19);
  auVar15 = vfmadd231ps_fma(auVar124,auVar74,auVar85);
  auVar187 = vfnmadd231ps_fma(auVar15,auVar74,auVar17);
  auVar15 = vshufps_avx(auVar18,auVar18,0xc9);
  fVar238 = auVar187._0_4_;
  auVar75._0_4_ = fVar238 * auVar15._0_4_;
  fVar253 = auVar187._4_4_;
  auVar75._4_4_ = fVar253 * auVar15._4_4_;
  fVar268 = auVar187._8_4_;
  auVar75._8_4_ = fVar268 * auVar15._8_4_;
  fVar279 = auVar187._12_4_;
  auVar75._12_4_ = fVar279 * auVar15._12_4_;
  auVar15 = vshufps_avx(auVar187,auVar187,0xc9);
  auVar124 = vfmsub231ps_fma(auVar75,auVar15,auVar18);
  auVar16 = vshufps_avx(auVar142,auVar142,0xc9);
  auVar76._0_4_ = fVar238 * auVar16._0_4_;
  auVar76._4_4_ = fVar253 * auVar16._4_4_;
  auVar76._8_4_ = fVar268 * auVar16._8_4_;
  auVar76._12_4_ = fVar279 * auVar16._12_4_;
  auVar74 = vfmsub231ps_fma(auVar76,auVar15,auVar142);
  fVar68 = fVar68 - auVar209._0_4_;
  auVar16 = vshufps_avx(auVar101,auVar101,0xc9);
  auVar15 = vdpps_avx(auVar16,auVar16,0x7f);
  auVar49._12_4_ = 0;
  auVar49._0_12_ = ZEXT812(0);
  auVar13 = vfmadd231ps_fma(auVar282,auVar49 << 0x20,auVar13);
  local_618._0_4_ = auVar73._0_4_;
  local_618._4_4_ = auVar73._4_4_;
  uStack_610._0_4_ = auVar73._8_4_;
  uStack_610._4_4_ = auVar73._12_4_;
  auVar281._0_4_ = auVar12._0_4_ + (float)local_618._0_4_;
  auVar281._4_4_ = auVar12._4_4_ + (float)local_618._4_4_;
  auVar281._8_4_ = auVar12._8_4_ + (float)uStack_610;
  auVar281._12_4_ = auVar12._12_4_ + uStack_610._4_4_;
  auVar189 = vfmadd231ps_fma(auVar13,auVar12,auVar49 << 0x20);
  fVar96 = auVar15._0_4_;
  auVar142 = ZEXT416((uint)fVar96);
  auVar12 = vrsqrtss_avx(auVar142,auVar142);
  fVar97 = auVar12._0_4_;
  fVar98 = fVar97 * 1.5 - fVar96 * 0.5 * fVar97 * fVar97 * fVar97;
  auVar13 = vpermilps_avx(auVar102,0xc9);
  auVar12 = vdpps_avx(auVar16,auVar13,0x7f);
  auVar208._0_4_ = fVar96 * auVar13._0_4_;
  auVar208._4_4_ = fVar96 * auVar13._4_4_;
  auVar208._8_4_ = fVar96 * auVar13._8_4_;
  auVar208._12_4_ = fVar96 * auVar13._12_4_;
  fVar96 = auVar12._0_4_;
  auVar241._0_4_ = fVar96 * auVar16._0_4_;
  auVar241._4_4_ = fVar96 * auVar16._4_4_;
  auVar241._8_4_ = fVar96 * auVar16._8_4_;
  auVar241._12_4_ = fVar96 * auVar16._12_4_;
  auVar18 = vsubps_avx(auVar208,auVar241);
  auVar12 = vrcpss_avx(auVar142,auVar142);
  auVar13 = vfnmadd213ss_fma(auVar15,auVar12,SUB6416(ZEXT464(0x40000000),0));
  fVar96 = auVar12._0_4_ * auVar13._0_4_;
  auVar142 = vpermilps_avx(auVar103,0xc9);
  auVar13 = vdpps_avx(auVar142,auVar142,0x7f);
  fVar157 = auVar16._0_4_ * fVar98;
  fVar167 = auVar16._4_4_ * fVar98;
  fVar168 = auVar16._8_4_ * fVar98;
  fVar169 = auVar16._12_4_ * fVar98;
  auVar16 = vpermilps_avx(auVar123,0xc9);
  auVar12 = vblendps_avx(auVar13,_DAT_01f7aa10,0xe);
  auVar15 = vrsqrtss_avx(auVar12,auVar12);
  fVar97 = auVar13._0_4_;
  fVar223 = auVar15._0_4_;
  auVar15 = vdpps_avx(auVar142,auVar16,0x7f);
  fVar223 = fVar223 * 1.5 - fVar223 * fVar97 * 0.5 * fVar223 * fVar223;
  auVar107._0_4_ = fVar97 * auVar16._0_4_;
  auVar107._4_4_ = fVar97 * auVar16._4_4_;
  auVar107._8_4_ = fVar97 * auVar16._8_4_;
  auVar107._12_4_ = fVar97 * auVar16._12_4_;
  fVar97 = auVar15._0_4_;
  auVar125._0_4_ = auVar142._0_4_ * fVar97;
  auVar125._4_4_ = auVar142._4_4_ * fVar97;
  auVar125._8_4_ = auVar142._8_4_ * fVar97;
  auVar125._12_4_ = auVar142._12_4_ * fVar97;
  auVar15 = vsubps_avx(auVar107,auVar125);
  auVar12 = vrcpss_avx(auVar12,auVar12);
  auVar13 = vfnmadd213ss_fma(auVar13,auVar12,ZEXT416(0x40000000));
  fVar97 = auVar12._0_4_ * auVar13._0_4_;
  fVar122 = auVar142._0_4_ * fVar223;
  fVar137 = auVar142._4_4_ * fVar223;
  fVar138 = auVar142._8_4_ * fVar223;
  fVar139 = auVar142._12_4_ * fVar223;
  auVar12 = vshufps_avx(auVar147,auVar147,0xff);
  auVar13 = vshufps_avx(auVar281,auVar281,0xff);
  auVar158._0_4_ = auVar13._0_4_ * fVar157;
  auVar158._4_4_ = auVar13._4_4_ * fVar167;
  auVar158._8_4_ = auVar13._8_4_ * fVar168;
  auVar158._12_4_ = auVar13._12_4_ * fVar169;
  auVar143._0_4_ = auVar12._0_4_ * fVar157 + fVar98 * fVar96 * auVar18._0_4_ * auVar13._0_4_;
  auVar143._4_4_ = auVar12._4_4_ * fVar167 + fVar98 * fVar96 * auVar18._4_4_ * auVar13._4_4_;
  auVar143._8_4_ = auVar12._8_4_ * fVar168 + fVar98 * fVar96 * auVar18._8_4_ * auVar13._8_4_;
  auVar143._12_4_ = auVar12._12_4_ * fVar169 + fVar98 * fVar96 * auVar18._12_4_ * auVar13._12_4_;
  auVar16 = vsubps_avx(auVar281,auVar158);
  local_568._4_4_ = auVar281._4_4_ + auVar158._4_4_;
  local_568._0_4_ = auVar281._0_4_ + auVar158._0_4_;
  fStack_560 = auVar281._8_4_ + auVar158._8_4_;
  fStack_55c = auVar281._12_4_ + auVar158._12_4_;
  auVar18 = vsubps_avx(auVar147,auVar143);
  auVar12 = vshufps_avx(auVar170,auVar170,0xff);
  auVar13 = vshufps_avx(auVar189,auVar189,0xff);
  auVar126._0_4_ = auVar13._0_4_ * fVar122;
  auVar126._4_4_ = auVar13._4_4_ * fVar137;
  auVar126._8_4_ = auVar13._8_4_ * fVar138;
  auVar126._12_4_ = auVar13._12_4_ * fVar139;
  auVar77._0_4_ = auVar12._0_4_ * fVar122 + auVar13._0_4_ * fVar223 * auVar15._0_4_ * fVar97;
  auVar77._4_4_ = auVar12._4_4_ * fVar137 + auVar13._4_4_ * fVar223 * auVar15._4_4_ * fVar97;
  auVar77._8_4_ = auVar12._8_4_ * fVar138 + auVar13._8_4_ * fVar223 * auVar15._8_4_ * fVar97;
  auVar77._12_4_ = auVar12._12_4_ * fVar139 + auVar13._12_4_ * fVar223 * auVar15._12_4_ * fVar97;
  auVar15 = vsubps_avx(auVar189,auVar126);
  local_5f8._4_4_ = auVar189._4_4_ + auVar126._4_4_;
  local_5f8._0_4_ = auVar189._0_4_ + auVar126._0_4_;
  fStack_5f0 = auVar189._8_4_ + auVar126._8_4_;
  fStack_5ec = auVar189._12_4_ + auVar126._12_4_;
  auVar142 = vsubps_avx(auVar170,auVar77);
  auVar50._12_4_ = 0;
  auVar50._0_12_ = ZEXT812(0);
  auVar12 = vfmadd231ps_fma(auVar255,auVar50 << 0x20,auVar85);
  local_478 = auVar71._0_4_;
  fStack_474 = auVar71._4_4_;
  fStack_470 = auVar71._8_4_;
  fStack_46c = auVar71._12_4_;
  auVar242._0_4_ = auVar17._0_4_ + local_478;
  auVar242._4_4_ = auVar17._4_4_ + fStack_474;
  auVar242._8_4_ = auVar17._8_4_ + fStack_470;
  auVar242._12_4_ = auVar17._12_4_ + fStack_46c;
  auVar19 = vfmadd231ps_fma(auVar12,auVar17,auVar50 << 0x20);
  auVar17 = vpermilps_avx(auVar274,0xc9);
  auVar12 = vdpps_avx(auVar17,auVar17,0x7f);
  fVar96 = auVar12._0_4_;
  auVar189 = ZEXT416((uint)fVar96);
  auVar13 = vrsqrtss_avx(auVar189,auVar189);
  fVar97 = auVar13._0_4_;
  auVar85 = vpermilps_avx(auVar72,0xc9);
  auVar13 = vdpps_avx(auVar17,auVar85,0x7f);
  fVar98 = fVar97 * 1.5 - fVar96 * 0.5 * fVar97 * fVar97 * fVar97;
  auVar258._0_4_ = fVar96 * auVar85._0_4_;
  auVar258._4_4_ = fVar96 * auVar85._4_4_;
  auVar258._8_4_ = fVar96 * auVar85._8_4_;
  auVar258._12_4_ = fVar96 * auVar85._12_4_;
  fVar96 = auVar13._0_4_;
  auVar270._0_4_ = fVar96 * auVar17._0_4_;
  auVar270._4_4_ = fVar96 * auVar17._4_4_;
  auVar270._8_4_ = fVar96 * auVar17._8_4_;
  auVar270._12_4_ = fVar96 * auVar17._12_4_;
  auVar85 = vsubps_avx(auVar258,auVar270);
  auVar13 = vrcpss_avx(auVar189,auVar189);
  auVar12 = vfnmadd213ss_fma(auVar12,auVar13,SUB6416(ZEXT464(0x40000000),0));
  fVar96 = auVar13._0_4_ * auVar12._0_4_;
  auVar189 = vpermilps_avx(auVar124,0xc9);
  auVar12 = vdpps_avx(auVar189,auVar189,0x7f);
  fVar122 = auVar17._0_4_ * fVar98;
  fVar137 = auVar17._4_4_ * fVar98;
  fVar138 = auVar17._8_4_ * fVar98;
  fVar139 = auVar17._12_4_ * fVar98;
  fVar97 = auVar12._0_4_;
  auVar209 = ZEXT416((uint)fVar97);
  auVar13 = vrsqrtss_avx(auVar209,auVar209);
  fVar223 = auVar13._0_4_;
  fVar223 = fVar223 * 1.5 - fVar97 * 0.5 * fVar223 * fVar223 * fVar223;
  auVar17 = vpermilps_avx(auVar74,0xc9);
  auVar13 = vdpps_avx(auVar189,auVar17,0x7f);
  auVar171._0_4_ = auVar17._0_4_ * fVar97;
  auVar171._4_4_ = auVar17._4_4_ * fVar97;
  auVar171._8_4_ = auVar17._8_4_ * fVar97;
  auVar171._12_4_ = auVar17._12_4_ * fVar97;
  fVar97 = auVar13._0_4_;
  auVar271._0_4_ = fVar97 * auVar189._0_4_;
  auVar271._4_4_ = fVar97 * auVar189._4_4_;
  auVar271._8_4_ = fVar97 * auVar189._8_4_;
  auVar271._12_4_ = fVar97 * auVar189._12_4_;
  auVar17 = vsubps_avx(auVar171,auVar271);
  auVar13 = vrcpss_avx(auVar209,auVar209);
  auVar12 = vfnmadd213ss_fma(auVar12,auVar13,SUB6416(ZEXT464(0x40000000),0));
  fVar97 = auVar12._0_4_ * auVar13._0_4_;
  fVar157 = auVar189._0_4_ * fVar223;
  fVar167 = auVar189._4_4_ * fVar223;
  fVar168 = auVar189._8_4_ * fVar223;
  fVar169 = auVar189._12_4_ * fVar223;
  auVar12 = vshufps_avx(auVar176,auVar176,0xff);
  auVar13 = vshufps_avx(auVar242,auVar242,0xff);
  auVar78._0_4_ = auVar13._0_4_ * fVar122;
  auVar78._4_4_ = auVar13._4_4_ * fVar137;
  auVar78._8_4_ = auVar13._8_4_ * fVar138;
  auVar78._12_4_ = auVar13._12_4_ * fVar139;
  auVar172._0_4_ = auVar12._0_4_ * fVar122 + auVar13._0_4_ * fVar98 * auVar85._0_4_ * fVar96;
  auVar172._4_4_ = auVar12._4_4_ * fVar137 + auVar13._4_4_ * fVar98 * auVar85._4_4_ * fVar96;
  auVar172._8_4_ = auVar12._8_4_ * fVar138 + auVar13._8_4_ * fVar98 * auVar85._8_4_ * fVar96;
  auVar172._12_4_ = auVar12._12_4_ * fVar139 + auVar13._12_4_ * fVar98 * auVar85._12_4_ * fVar96;
  auVar85 = vsubps_avx(auVar242,auVar78);
  auVar189 = vsubps_avx(auVar176,auVar172);
  auVar12 = vshufps_avx(auVar187,auVar187,0xff);
  auVar13 = vshufps_avx(auVar19,auVar19,0xff);
  auVar210._0_4_ = auVar13._0_4_ * fVar157;
  auVar210._4_4_ = auVar13._4_4_ * fVar167;
  auVar210._8_4_ = auVar13._8_4_ * fVar168;
  auVar210._12_4_ = auVar13._12_4_ * fVar169;
  auVar144._0_4_ = auVar12._0_4_ * fVar157 + auVar13._0_4_ * fVar223 * auVar17._0_4_ * fVar97;
  auVar144._4_4_ = auVar12._4_4_ * fVar167 + auVar13._4_4_ * fVar223 * auVar17._4_4_ * fVar97;
  auVar144._8_4_ = auVar12._8_4_ * fVar168 + auVar13._8_4_ * fVar223 * auVar17._8_4_ * fVar97;
  auVar144._12_4_ = auVar12._12_4_ * fVar169 + auVar13._12_4_ * fVar223 * auVar17._12_4_ * fVar97;
  auVar12 = vsubps_avx(auVar19,auVar210);
  auVar314._0_4_ = auVar19._0_4_ + auVar210._0_4_;
  auVar314._4_4_ = auVar19._4_4_ + auVar210._4_4_;
  auVar314._8_4_ = auVar19._8_4_ + auVar210._8_4_;
  auVar314._12_4_ = auVar19._12_4_ + auVar210._12_4_;
  auVar13 = vsubps_avx(auVar187,auVar144);
  local_588._0_4_ = auVar18._0_4_;
  local_588._4_4_ = auVar18._4_4_;
  uStack_580._0_4_ = auVar18._8_4_;
  uStack_580._4_4_ = auVar18._12_4_;
  auVar145._0_4_ = auVar16._0_4_ + (float)local_588._0_4_ * 0.33333334;
  auVar145._4_4_ = auVar16._4_4_ + (float)local_588._4_4_ * 0.33333334;
  auVar145._8_4_ = auVar16._8_4_ + (float)uStack_580 * 0.33333334;
  auVar145._12_4_ = auVar16._12_4_ + uStack_580._4_4_ * 0.33333334;
  fVar96 = 1.0 - fVar68;
  auVar211._4_4_ = fVar96;
  auVar211._0_4_ = fVar96;
  auVar211._8_4_ = fVar96;
  auVar211._12_4_ = fVar96;
  auVar272._0_4_ = fVar68 * auVar85._0_4_;
  auVar272._4_4_ = fVar68 * auVar85._4_4_;
  auVar272._8_4_ = fVar68 * auVar85._8_4_;
  auVar272._12_4_ = fVar68 * auVar85._12_4_;
  local_408 = vfmadd231ps_fma(auVar272,auVar211,auVar16);
  auVar79._0_4_ = fVar68 * (auVar85._0_4_ + auVar189._0_4_ * 0.33333334);
  auVar79._4_4_ = fVar68 * (auVar85._4_4_ + auVar189._4_4_ * 0.33333334);
  auVar79._8_4_ = fVar68 * (auVar85._8_4_ + auVar189._8_4_ * 0.33333334);
  auVar79._12_4_ = fVar68 * (auVar85._12_4_ + auVar189._12_4_ * 0.33333334);
  auVar189 = vfmadd231ps_fma(auVar79,auVar211,auVar145);
  local_5b8 = auVar142._0_4_;
  fStack_5b4 = auVar142._4_4_;
  fStack_5b0 = auVar142._8_4_;
  fStack_5ac = auVar142._12_4_;
  auVar108._0_4_ = local_5b8 * 0.33333334;
  auVar108._4_4_ = fStack_5b4 * 0.33333334;
  auVar108._8_4_ = fStack_5b0 * 0.33333334;
  auVar108._12_4_ = fStack_5ac * 0.33333334;
  auVar85 = vsubps_avx(auVar15,auVar108);
  auVar292._0_4_ = auVar281._0_4_ + auVar158._0_4_ + (fVar99 + auVar143._0_4_) * 0.33333334;
  auVar292._4_4_ = auVar281._4_4_ + auVar158._4_4_ + (fVar322 + auVar143._4_4_) * 0.33333334;
  auVar292._8_4_ = auVar281._8_4_ + auVar158._8_4_ + (fVar323 + auVar143._8_4_) * 0.33333334;
  auVar292._12_4_ = auVar281._12_4_ + auVar158._12_4_ + (fVar324 + auVar143._12_4_) * 0.33333334;
  auVar273._0_4_ = (fVar70 + auVar77._0_4_) * 0.33333334;
  auVar273._4_4_ = (fVar155 + auVar77._4_4_) * 0.33333334;
  auVar273._8_4_ = (fVar156 + auVar77._8_4_) * 0.33333334;
  auVar273._12_4_ = (fVar204 + auVar77._12_4_) * 0.33333334;
  auVar16 = vsubps_avx(_local_5f8,auVar273);
  auVar173._0_4_ = auVar13._0_4_ * 0.33333334;
  auVar173._4_4_ = auVar13._4_4_ * 0.33333334;
  auVar173._8_4_ = auVar13._8_4_ * 0.33333334;
  auVar173._12_4_ = auVar13._12_4_ * 0.33333334;
  auVar13 = vsubps_avx(auVar12,auVar173);
  auVar243._0_4_ = (fVar238 + auVar144._0_4_) * 0.33333334;
  auVar243._4_4_ = (fVar253 + auVar144._4_4_) * 0.33333334;
  auVar243._8_4_ = (fVar268 + auVar144._8_4_) * 0.33333334;
  auVar243._12_4_ = (fVar279 + auVar144._12_4_) * 0.33333334;
  auVar17 = vsubps_avx(auVar314,auVar243);
  auVar304._0_4_ = fVar68 * auVar13._0_4_;
  auVar304._4_4_ = fVar68 * auVar13._4_4_;
  auVar304._8_4_ = fVar68 * auVar13._8_4_;
  auVar304._12_4_ = fVar68 * auVar13._12_4_;
  auVar228._0_4_ = fVar68 * auVar12._0_4_;
  auVar228._4_4_ = fVar68 * auVar12._4_4_;
  auVar228._8_4_ = fVar68 * auVar12._8_4_;
  auVar228._12_4_ = fVar68 * auVar12._12_4_;
  local_418 = vfmadd231ps_fma(auVar304,auVar211,auVar85);
  auVar142 = vfmadd231ps_fma(auVar228,auVar211,auVar15);
  auVar109._0_4_ = fVar68 * (auVar242._0_4_ + auVar78._0_4_);
  auVar109._4_4_ = fVar68 * (auVar242._4_4_ + auVar78._4_4_);
  auVar109._8_4_ = fVar68 * (auVar242._8_4_ + auVar78._8_4_);
  auVar109._12_4_ = fVar68 * (auVar242._12_4_ + auVar78._12_4_);
  auVar174._0_4_ =
       fVar68 * (auVar242._0_4_ + auVar78._0_4_ + (fVar219 + auVar172._0_4_) * 0.33333334);
  auVar174._4_4_ =
       fVar68 * (auVar242._4_4_ + auVar78._4_4_ + (fVar220 + auVar172._4_4_) * 0.33333334);
  auVar174._8_4_ =
       fVar68 * (auVar242._8_4_ + auVar78._8_4_ + (fVar221 + auVar172._8_4_) * 0.33333334);
  auVar174._12_4_ =
       fVar68 * (auVar242._12_4_ + auVar78._12_4_ + (fVar222 + auVar172._12_4_) * 0.33333334);
  auVar190._0_4_ = fVar68 * auVar17._0_4_;
  auVar190._4_4_ = fVar68 * auVar17._4_4_;
  auVar190._8_4_ = fVar68 * auVar17._8_4_;
  auVar190._12_4_ = fVar68 * auVar17._12_4_;
  auVar229._0_4_ = fVar68 * auVar314._0_4_;
  auVar229._4_4_ = fVar68 * auVar314._4_4_;
  auVar229._8_4_ = fVar68 * auVar314._8_4_;
  auVar229._12_4_ = fVar68 * auVar314._12_4_;
  _local_428 = vfmadd231ps_fma(auVar109,auVar211,_local_568);
  _local_438 = vfmadd231ps_fma(auVar174,auVar211,auVar292);
  auVar19 = vfmadd231ps_fma(auVar190,auVar211,auVar16);
  auVar12 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x1c);
  auVar12 = vinsertps_avx(auVar12,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  auVar209 = vfmadd231ps_fma(auVar229,auVar211,_local_5f8);
  local_3e8 = vsubps_avx(local_408,auVar12);
  auVar13 = vshufps_avx(local_3e8,local_3e8,0x55);
  auVar85 = vshufps_avx(local_3e8,local_3e8,0xaa);
  aVar3 = pre->ray_space[k].vy.field_0;
  fVar68 = pre->ray_space[k].vz.field_0.m128[0];
  fVar96 = pre->ray_space[k].vz.field_0.m128[1];
  fVar97 = pre->ray_space[k].vz.field_0.m128[2];
  fVar98 = pre->ray_space[k].vz.field_0.m128[3];
  auVar80._0_4_ = fVar68 * auVar85._0_4_;
  auVar80._4_4_ = fVar96 * auVar85._4_4_;
  auVar80._8_4_ = fVar97 * auVar85._8_4_;
  auVar80._12_4_ = fVar98 * auVar85._12_4_;
  auVar15 = vfmadd231ps_fma(auVar80,(undefined1  [16])aVar3,auVar13);
  local_3f8 = vsubps_avx(auVar189,auVar12);
  auVar13 = vshufps_avx(local_3f8,local_3f8,0x55);
  auVar85 = vshufps_avx(local_3f8,local_3f8,0xaa);
  auVar315._0_4_ = fVar68 * auVar85._0_4_;
  auVar315._4_4_ = fVar96 * auVar85._4_4_;
  auVar315._8_4_ = fVar97 * auVar85._8_4_;
  auVar315._12_4_ = fVar98 * auVar85._12_4_;
  auVar85 = vfmadd231ps_fma(auVar315,(undefined1  [16])aVar3,auVar13);
  local_268 = vsubps_avx(local_418,auVar12);
  auVar13 = vshufps_avx(local_268,local_268,0xaa);
  auVar293._0_4_ = fVar68 * auVar13._0_4_;
  auVar293._4_4_ = fVar96 * auVar13._4_4_;
  auVar293._8_4_ = fVar97 * auVar13._8_4_;
  auVar293._12_4_ = fVar98 * auVar13._12_4_;
  auVar13 = vshufps_avx(local_268,local_268,0x55);
  auVar16 = vfmadd231ps_fma(auVar293,(undefined1  [16])aVar3,auVar13);
  local_278 = vsubps_avx(auVar142,auVar12);
  auVar13 = vshufps_avx(local_278,local_278,0xaa);
  auVar305._0_4_ = fVar68 * auVar13._0_4_;
  auVar305._4_4_ = fVar96 * auVar13._4_4_;
  auVar305._8_4_ = fVar97 * auVar13._8_4_;
  auVar305._12_4_ = fVar98 * auVar13._12_4_;
  auVar13 = vshufps_avx(local_278,local_278,0x55);
  auVar17 = vfmadd231ps_fma(auVar305,(undefined1  [16])aVar3,auVar13);
  local_288 = vsubps_avx(_local_428,auVar12);
  auVar13 = vshufps_avx(local_288,local_288,0xaa);
  auVar159._0_4_ = fVar68 * auVar13._0_4_;
  auVar159._4_4_ = fVar96 * auVar13._4_4_;
  auVar159._8_4_ = fVar97 * auVar13._8_4_;
  auVar159._12_4_ = fVar98 * auVar13._12_4_;
  auVar13 = vshufps_avx(local_288,local_288,0x55);
  auVar18 = vfmadd231ps_fma(auVar159,(undefined1  [16])aVar3,auVar13);
  local_298 = vsubps_avx(_local_438,auVar12);
  auVar13 = vshufps_avx(local_298,local_298,0xaa);
  auVar212._0_4_ = fVar68 * auVar13._0_4_;
  auVar212._4_4_ = fVar96 * auVar13._4_4_;
  auVar212._8_4_ = fVar97 * auVar13._8_4_;
  auVar212._12_4_ = fVar98 * auVar13._12_4_;
  auVar13 = vshufps_avx(local_298,local_298,0x55);
  auVar255 = vfmadd231ps_fma(auVar212,(undefined1  [16])aVar3,auVar13);
  local_2a8 = vsubps_avx(auVar19,auVar12);
  auVar13 = vshufps_avx(local_2a8,local_2a8,0xaa);
  auVar244._0_4_ = fVar68 * auVar13._0_4_;
  auVar244._4_4_ = fVar96 * auVar13._4_4_;
  auVar244._8_4_ = fVar97 * auVar13._8_4_;
  auVar244._12_4_ = fVar98 * auVar13._12_4_;
  auVar13 = vshufps_avx(local_2a8,local_2a8,0x55);
  auVar13 = vfmadd231ps_fma(auVar244,(undefined1  [16])aVar3,auVar13);
  local_2b8 = vsubps_avx(auVar209,auVar12);
  auVar12 = vshufps_avx(local_2b8,local_2b8,0xaa);
  auVar175._0_4_ = fVar68 * auVar12._0_4_;
  auVar175._4_4_ = fVar96 * auVar12._4_4_;
  auVar175._8_4_ = fVar97 * auVar12._8_4_;
  auVar175._12_4_ = fVar98 * auVar12._12_4_;
  auVar12 = vshufps_avx(local_2b8,local_2b8,0x55);
  auVar12 = vfmadd231ps_fma(auVar175,(undefined1  [16])aVar3,auVar12);
  auVar191._4_4_ = local_3e8._0_4_;
  auVar191._0_4_ = local_3e8._0_4_;
  auVar191._8_4_ = local_3e8._0_4_;
  auVar191._12_4_ = local_3e8._0_4_;
  aVar3 = pre->ray_space[k].vx.field_0;
  auVar72 = vfmadd231ps_fma(auVar15,(undefined1  [16])aVar3,auVar191);
  auVar192._4_4_ = local_3f8._0_4_;
  auVar192._0_4_ = local_3f8._0_4_;
  auVar192._8_4_ = local_3f8._0_4_;
  auVar192._12_4_ = local_3f8._0_4_;
  auVar73 = vfmadd231ps_fma(auVar85,(undefined1  [16])aVar3,auVar192);
  uVar69 = local_268._0_4_;
  auVar193._4_4_ = uVar69;
  auVar193._0_4_ = uVar69;
  auVar193._8_4_ = uVar69;
  auVar193._12_4_ = uVar69;
  auVar282 = vfmadd231ps_fma(auVar16,(undefined1  [16])aVar3,auVar193);
  uVar69 = local_278._0_4_;
  auVar194._4_4_ = uVar69;
  auVar194._0_4_ = uVar69;
  auVar194._8_4_ = uVar69;
  auVar194._12_4_ = uVar69;
  auVar71 = vfmadd231ps_fma(auVar17,(undefined1  [16])aVar3,auVar194);
  uVar69 = local_288._0_4_;
  auVar195._4_4_ = uVar69;
  auVar195._0_4_ = uVar69;
  auVar195._8_4_ = uVar69;
  auVar195._12_4_ = uVar69;
  auVar101 = vfmadd231ps_fma(auVar18,(undefined1  [16])aVar3,auVar195);
  uVar69 = local_298._0_4_;
  auVar196._4_4_ = uVar69;
  auVar196._0_4_ = uVar69;
  auVar196._8_4_ = uVar69;
  auVar196._12_4_ = uVar69;
  auVar255 = vfmadd231ps_fma(auVar255,(undefined1  [16])aVar3,auVar196);
  uVar69 = local_2a8._0_4_;
  auVar197._4_4_ = uVar69;
  auVar197._0_4_ = uVar69;
  auVar197._8_4_ = uVar69;
  auVar197._12_4_ = uVar69;
  auVar102 = vfmadd231ps_fma(auVar13,(undefined1  [16])aVar3,auVar197);
  uVar69 = local_2b8._0_4_;
  auVar198._4_4_ = uVar69;
  auVar198._0_4_ = uVar69;
  auVar198._8_4_ = uVar69;
  auVar198._12_4_ = uVar69;
  auVar103 = vfmadd231ps_fma(auVar12,(undefined1  [16])aVar3,auVar198);
  auVar15 = vmovlhps_avx(auVar72,auVar101);
  auVar16 = vmovlhps_avx(auVar73,auVar255);
  auVar17 = vmovlhps_avx(auVar282,auVar102);
  auVar18 = vmovlhps_avx(auVar71,auVar103);
  auVar12 = vminps_avx(auVar15,auVar16);
  auVar13 = vminps_avx(auVar17,auVar18);
  auVar85 = vminps_avx(auVar12,auVar13);
  auVar12 = vmaxps_avx(auVar15,auVar16);
  auVar13 = vmaxps_avx(auVar17,auVar18);
  auVar12 = vmaxps_avx(auVar12,auVar13);
  auVar13 = vshufpd_avx(auVar85,auVar85,3);
  auVar85 = vminps_avx(auVar85,auVar13);
  auVar13 = vshufpd_avx(auVar12,auVar12,3);
  auVar13 = vmaxps_avx(auVar12,auVar13);
  auVar12 = vandps_avx(auVar312,auVar85);
  auVar13 = vandps_avx(auVar13,auVar312);
  auVar12 = vmaxps_avx(auVar12,auVar13);
  auVar13 = vmovshdup_avx(auVar12);
  auVar12 = vmaxss_avx(auVar13,auVar12);
  fVar96 = auVar12._0_4_ * 9.536743e-07;
  auVar230._8_8_ = auVar72._0_8_;
  auVar230._0_8_ = auVar72._0_8_;
  auVar259._8_8_ = auVar73._0_8_;
  auVar259._0_8_ = auVar73._0_8_;
  auVar294._0_8_ = auVar282._0_8_;
  auVar294._8_8_ = auVar294._0_8_;
  auVar306._0_8_ = auVar71._0_8_;
  auVar306._8_8_ = auVar306._0_8_;
  local_228 = -fVar96;
  fStack_224 = local_228;
  fStack_220 = local_228;
  fStack_21c = local_228;
  fStack_218 = local_228;
  fStack_214 = local_228;
  fStack_210 = local_228;
  fStack_20c = local_228;
  local_2e8 = uVar57;
  uStack_2e4 = uVar57;
  uStack_2e0 = uVar57;
  uStack_2dc = uVar57;
  uStack_2f4 = local_2f8;
  uStack_2f0 = local_2f8;
  uStack_2ec = local_2f8;
  uVar58 = 0;
  uVar65 = 0;
  fVar68 = *(float *)(ray + k * 4 + 0x30);
  local_238 = vsubps_avx(auVar16,auVar15);
  local_248 = vsubps_avx(auVar17,auVar16);
  local_258 = vsubps_avx(auVar18,auVar17);
  local_308 = vsubps_avx(_local_428,local_408);
  local_318 = vsubps_avx(_local_438,auVar189);
  local_328 = vsubps_avx(auVar19,local_418);
  _local_338 = vsubps_avx(auVar209,auVar142);
  auVar321 = ZEXT1664(ZEXT816(0x3f80000000000000));
  auVar290 = ZEXT1664(ZEXT816(0x3f80000000000000));
  local_208 = fVar96;
  fStack_204 = fVar96;
  fStack_200 = fVar96;
  fStack_1fc = fVar96;
  fStack_1f8 = fVar96;
  fStack_1f4 = fVar96;
  fStack_1f0 = fVar96;
  fStack_1ec = fVar96;
LAB_016aff92:
  local_2c8 = auVar290._0_16_;
  auVar176 = auVar321._0_16_;
  auVar12 = vshufps_avx(auVar176,auVar176,0x50);
  auVar316._8_4_ = 0x3f800000;
  auVar316._0_8_ = 0x3f8000003f800000;
  auVar316._12_4_ = 0x3f800000;
  auVar319._16_4_ = 0x3f800000;
  auVar319._0_16_ = auVar316;
  auVar319._20_4_ = 0x3f800000;
  auVar319._24_4_ = 0x3f800000;
  auVar319._28_4_ = 0x3f800000;
  auVar13 = vsubps_avx(auVar316,auVar12);
  fVar97 = auVar12._0_4_;
  fVar155 = auVar101._0_4_;
  auVar81._0_4_ = fVar155 * fVar97;
  fVar98 = auVar12._4_4_;
  fVar156 = auVar101._4_4_;
  auVar81._4_4_ = fVar156 * fVar98;
  fVar223 = auVar12._8_4_;
  auVar81._8_4_ = fVar155 * fVar223;
  fVar122 = auVar12._12_4_;
  auVar81._12_4_ = fVar156 * fVar122;
  fVar157 = auVar255._0_4_;
  auVar199._0_4_ = fVar157 * fVar97;
  fVar167 = auVar255._4_4_;
  auVar199._4_4_ = fVar167 * fVar98;
  auVar199._8_4_ = fVar157 * fVar223;
  auVar199._12_4_ = fVar167 * fVar122;
  fVar238 = auVar102._0_4_;
  auVar160._0_4_ = fVar238 * fVar97;
  fVar253 = auVar102._4_4_;
  auVar160._4_4_ = fVar253 * fVar98;
  auVar160._8_4_ = fVar238 * fVar223;
  auVar160._12_4_ = fVar253 * fVar122;
  fVar268 = auVar103._0_4_;
  auVar127._0_4_ = fVar268 * fVar97;
  fVar279 = auVar103._4_4_;
  auVar127._4_4_ = fVar279 * fVar98;
  auVar127._8_4_ = fVar268 * fVar223;
  auVar127._12_4_ = fVar279 * fVar122;
  auVar73 = vfmadd231ps_fma(auVar81,auVar13,auVar230);
  auVar282 = vfmadd231ps_fma(auVar199,auVar13,auVar259);
  auVar71 = vfmadd231ps_fma(auVar160,auVar13,auVar294);
  auVar123 = vfmadd231ps_fma(auVar127,auVar306,auVar13);
  auVar12 = vmovshdup_avx(auVar290._0_16_);
  fVar97 = auVar290._0_4_;
  fStack_c0 = (auVar12._0_4_ - fVar97) * 0.04761905;
  auVar252._4_4_ = fVar97;
  auVar252._0_4_ = fVar97;
  auVar252._8_4_ = fVar97;
  auVar252._12_4_ = fVar97;
  auVar252._16_4_ = fVar97;
  auVar252._20_4_ = fVar97;
  auVar252._24_4_ = fVar97;
  auVar252._28_4_ = fVar97;
  auVar118._0_8_ = auVar12._0_8_;
  auVar118._8_8_ = auVar118._0_8_;
  auVar118._16_8_ = auVar118._0_8_;
  auVar118._24_8_ = auVar118._0_8_;
  auVar93 = vsubps_avx(auVar118,auVar252);
  uVar69 = auVar73._0_4_;
  auVar310._4_4_ = uVar69;
  auVar310._0_4_ = uVar69;
  auVar310._8_4_ = uVar69;
  auVar310._12_4_ = uVar69;
  auVar310._16_4_ = uVar69;
  auVar310._20_4_ = uVar69;
  auVar310._24_4_ = uVar69;
  auVar310._28_4_ = uVar69;
  auVar12 = vmovshdup_avx(auVar73);
  uVar100 = auVar12._0_8_;
  auVar300._8_8_ = uVar100;
  auVar300._0_8_ = uVar100;
  auVar300._16_8_ = uVar100;
  auVar300._24_8_ = uVar100;
  fVar204 = auVar282._0_4_;
  auVar287._4_4_ = fVar204;
  auVar287._0_4_ = fVar204;
  auVar287._8_4_ = fVar204;
  auVar287._12_4_ = fVar204;
  auVar287._16_4_ = fVar204;
  auVar287._20_4_ = fVar204;
  auVar287._24_4_ = fVar204;
  auVar287._28_4_ = fVar204;
  auVar13 = vmovshdup_avx(auVar282);
  auVar119._0_8_ = auVar13._0_8_;
  auVar119._8_8_ = auVar119._0_8_;
  auVar119._16_8_ = auVar119._0_8_;
  auVar119._24_8_ = auVar119._0_8_;
  fVar70 = auVar71._0_4_;
  auVar216._4_4_ = fVar70;
  auVar216._0_4_ = fVar70;
  auVar216._8_4_ = fVar70;
  auVar216._12_4_ = fVar70;
  auVar216._16_4_ = fVar70;
  auVar216._20_4_ = fVar70;
  auVar216._24_4_ = fVar70;
  auVar216._28_4_ = fVar70;
  auVar85 = vmovshdup_avx(auVar71);
  auVar236._0_8_ = auVar85._0_8_;
  auVar236._8_8_ = auVar236._0_8_;
  auVar236._16_8_ = auVar236._0_8_;
  auVar236._24_8_ = auVar236._0_8_;
  fVar139 = auVar123._0_4_;
  auVar72 = vmovshdup_avx(auVar123);
  auVar274 = vfmadd132ps_fma(auVar93,auVar252,_DAT_01faff20);
  auVar93 = vsubps_avx(auVar319,ZEXT1632(auVar274));
  fVar97 = auVar274._0_4_;
  fVar98 = auVar274._4_4_;
  auVar20._4_4_ = fVar204 * fVar98;
  auVar20._0_4_ = fVar204 * fVar97;
  fVar223 = auVar274._8_4_;
  auVar20._8_4_ = fVar204 * fVar223;
  fVar122 = auVar274._12_4_;
  auVar20._12_4_ = fVar204 * fVar122;
  auVar20._16_4_ = fVar204 * 0.0;
  auVar20._20_4_ = fVar204 * 0.0;
  auVar20._24_4_ = fVar204 * 0.0;
  auVar20._28_4_ = 0x3f800000;
  auVar274 = vfmadd231ps_fma(auVar20,auVar93,auVar310);
  fVar137 = auVar13._0_4_;
  fVar138 = auVar13._4_4_;
  auVar21._4_4_ = fVar138 * fVar98;
  auVar21._0_4_ = fVar137 * fVar97;
  auVar21._8_4_ = fVar137 * fVar223;
  auVar21._12_4_ = fVar138 * fVar122;
  auVar21._16_4_ = fVar137 * 0.0;
  auVar21._20_4_ = fVar138 * 0.0;
  auVar21._24_4_ = fVar137 * 0.0;
  auVar21._28_4_ = uVar69;
  auVar124 = vfmadd231ps_fma(auVar21,auVar93,auVar300);
  auVar22._4_4_ = fVar70 * fVar98;
  auVar22._0_4_ = fVar70 * fVar97;
  auVar22._8_4_ = fVar70 * fVar223;
  auVar22._12_4_ = fVar70 * fVar122;
  auVar22._16_4_ = fVar70 * 0.0;
  auVar22._20_4_ = fVar70 * 0.0;
  auVar22._24_4_ = fVar70 * 0.0;
  auVar22._28_4_ = auVar12._4_4_;
  auVar74 = vfmadd231ps_fma(auVar22,auVar93,auVar287);
  fVar137 = auVar85._0_4_;
  fVar138 = auVar85._4_4_;
  auVar14._4_4_ = fVar138 * fVar98;
  auVar14._0_4_ = fVar137 * fVar97;
  auVar14._8_4_ = fVar137 * fVar223;
  auVar14._12_4_ = fVar138 * fVar122;
  auVar14._16_4_ = fVar137 * 0.0;
  auVar14._20_4_ = fVar138 * 0.0;
  auVar14._24_4_ = fVar137 * 0.0;
  auVar14._28_4_ = fVar204;
  auVar147 = vfmadd231ps_fma(auVar14,auVar93,auVar119);
  auVar12 = vshufps_avx(auVar73,auVar73,0xaa);
  uStack_580 = auVar12._0_8_;
  local_588 = (undefined1  [8])uStack_580;
  uStack_578 = uStack_580;
  uStack_570 = uStack_580;
  auVar13 = vshufps_avx(auVar73,auVar73,0xff);
  uStack_610 = auVar13._0_8_;
  local_618 = (undefined1  [8])uStack_610;
  uStack_608 = uStack_610;
  uStack_600 = uStack_610;
  auVar23._4_4_ = fVar139 * fVar98;
  auVar23._0_4_ = fVar139 * fVar97;
  auVar23._8_4_ = fVar139 * fVar223;
  auVar23._12_4_ = fVar139 * fVar122;
  auVar23._16_4_ = fVar139 * 0.0;
  auVar23._20_4_ = fVar139 * 0.0;
  auVar23._24_4_ = fVar139 * 0.0;
  auVar23._28_4_ = fVar139;
  auVar73 = vfmadd231ps_fma(auVar23,auVar93,auVar216);
  auVar13 = vshufps_avx(auVar282,auVar282,0xaa);
  auVar217._0_8_ = auVar13._0_8_;
  auVar217._8_8_ = auVar217._0_8_;
  auVar217._16_8_ = auVar217._0_8_;
  auVar217._24_8_ = auVar217._0_8_;
  auVar85 = vshufps_avx(auVar282,auVar282,0xff);
  local_558._8_8_ = auVar85._0_8_;
  local_558._0_8_ = local_558._8_8_;
  local_558._16_8_ = local_558._8_8_;
  local_558._24_8_ = local_558._8_8_;
  fVar137 = auVar72._0_4_;
  fVar138 = auVar72._4_4_;
  auVar24._4_4_ = fVar138 * fVar98;
  auVar24._0_4_ = fVar137 * fVar97;
  auVar24._8_4_ = fVar137 * fVar223;
  auVar24._12_4_ = fVar138 * fVar122;
  auVar24._16_4_ = fVar137 * 0.0;
  auVar24._20_4_ = fVar138 * 0.0;
  auVar24._24_4_ = fVar137 * 0.0;
  auVar24._28_4_ = auVar12._4_4_;
  auVar170 = vfmadd231ps_fma(auVar24,auVar93,auVar236);
  auVar25._28_4_ = fVar138;
  auVar25._0_28_ =
       ZEXT1628(CONCAT412(auVar74._12_4_ * fVar122,
                          CONCAT48(auVar74._8_4_ * fVar223,
                                   CONCAT44(auVar74._4_4_ * fVar98,auVar74._0_4_ * fVar97))));
  auVar274 = vfmadd231ps_fma(auVar25,auVar93,ZEXT1632(auVar274));
  fVar137 = auVar85._4_4_;
  auVar26._28_4_ = fVar137;
  auVar26._0_28_ =
       ZEXT1628(CONCAT412(auVar147._12_4_ * fVar122,
                          CONCAT48(auVar147._8_4_ * fVar223,
                                   CONCAT44(auVar147._4_4_ * fVar98,auVar147._0_4_ * fVar97))));
  auVar124 = vfmadd231ps_fma(auVar26,auVar93,ZEXT1632(auVar124));
  auVar12 = vshufps_avx(auVar71,auVar71,0xaa);
  uVar100 = auVar12._0_8_;
  auVar203._8_8_ = uVar100;
  auVar203._0_8_ = uVar100;
  auVar203._16_8_ = uVar100;
  auVar203._24_8_ = uVar100;
  auVar72 = vshufps_avx(auVar71,auVar71,0xff);
  uVar100 = auVar72._0_8_;
  auVar320._8_8_ = uVar100;
  auVar320._0_8_ = uVar100;
  auVar320._16_8_ = uVar100;
  auVar320._24_8_ = uVar100;
  auVar71 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar73._12_4_ * fVar122,
                                               CONCAT48(auVar73._8_4_ * fVar223,
                                                        CONCAT44(auVar73._4_4_ * fVar98,
                                                                 auVar73._0_4_ * fVar97)))),auVar93,
                            ZEXT1632(auVar74));
  auVar73 = vshufps_avx(auVar123,auVar123,0xaa);
  auVar282 = vshufps_avx(auVar123,auVar123,0xff);
  auVar123 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar122 * auVar170._12_4_,
                                                CONCAT48(fVar223 * auVar170._8_4_,
                                                         CONCAT44(fVar98 * auVar170._4_4_,
                                                                  fVar97 * auVar170._0_4_)))),
                             auVar93,ZEXT1632(auVar147));
  auVar74 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar122 * auVar71._12_4_,
                                               CONCAT48(fVar223 * auVar71._8_4_,
                                                        CONCAT44(fVar98 * auVar71._4_4_,
                                                                 fVar97 * auVar71._0_4_)))),auVar93,
                            ZEXT1632(auVar274));
  auVar20 = vsubps_avx(ZEXT1632(auVar71),ZEXT1632(auVar274));
  auVar71 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar122 * auVar123._12_4_,
                                               CONCAT48(fVar223 * auVar123._8_4_,
                                                        CONCAT44(fVar98 * auVar123._4_4_,
                                                                 fVar97 * auVar123._0_4_)))),auVar93
                            ,ZEXT1632(auVar124));
  auVar21 = vsubps_avx(ZEXT1632(auVar123),ZEXT1632(auVar124));
  fStack_47c = auVar21._28_4_;
  auVar288._0_4_ = fStack_c0 * auVar20._0_4_ * 3.0;
  auVar288._4_4_ = fStack_c0 * auVar20._4_4_ * 3.0;
  auVar288._8_4_ = fStack_c0 * auVar20._8_4_ * 3.0;
  auVar288._12_4_ = fStack_c0 * auVar20._12_4_ * 3.0;
  auVar288._16_4_ = fStack_c0 * auVar20._16_4_ * 3.0;
  auVar288._20_4_ = fStack_c0 * auVar20._20_4_ * 3.0;
  auVar288._24_4_ = fStack_c0 * auVar20._24_4_ * 3.0;
  auVar288._28_4_ = 0;
  local_498._0_4_ = fStack_c0 * auVar21._0_4_ * 3.0;
  local_498._4_4_ = fStack_c0 * auVar21._4_4_ * 3.0;
  fStack_490 = fStack_c0 * auVar21._8_4_ * 3.0;
  fStack_48c = fStack_c0 * auVar21._12_4_ * 3.0;
  fStack_488 = fStack_c0 * auVar21._16_4_ * 3.0;
  fStack_484 = fStack_c0 * auVar21._20_4_ * 3.0;
  fStack_480 = fStack_c0 * auVar21._24_4_ * 3.0;
  fVar138 = auVar13._0_4_;
  fVar139 = auVar13._4_4_;
  auVar289._4_4_ = fVar139 * fVar98;
  auVar289._0_4_ = fVar138 * fVar97;
  auVar289._8_4_ = fVar138 * fVar223;
  auVar289._12_4_ = fVar139 * fVar122;
  auVar289._16_4_ = fVar138 * 0.0;
  auVar289._20_4_ = fVar139 * 0.0;
  auVar289._24_4_ = fVar138 * 0.0;
  auVar289._28_4_ = fStack_47c;
  auVar13 = vfmadd231ps_fma(auVar289,auVar93,_local_588);
  fVar138 = auVar85._0_4_;
  auVar28._4_4_ = fVar137 * fVar98;
  auVar28._0_4_ = fVar138 * fVar97;
  auVar28._8_4_ = fVar138 * fVar223;
  auVar28._12_4_ = fVar137 * fVar122;
  auVar28._16_4_ = fVar138 * 0.0;
  auVar28._20_4_ = fVar137 * 0.0;
  auVar28._24_4_ = fVar138 * 0.0;
  auVar28._28_4_ = 0;
  auVar85 = vfmadd231ps_fma(auVar28,auVar93,_local_618);
  fVar137 = auVar12._0_4_;
  fVar138 = auVar12._4_4_;
  auVar29._4_4_ = fVar138 * fVar98;
  auVar29._0_4_ = fVar137 * fVar97;
  auVar29._8_4_ = fVar137 * fVar223;
  auVar29._12_4_ = fVar138 * fVar122;
  auVar29._16_4_ = fVar137 * 0.0;
  auVar29._20_4_ = fVar138 * 0.0;
  auVar29._24_4_ = fVar137 * 0.0;
  auVar29._28_4_ = auVar20._28_4_;
  auVar12 = vfmadd231ps_fma(auVar29,auVar93,auVar217);
  fVar137 = auVar72._0_4_;
  fVar70 = auVar72._4_4_;
  auVar30._4_4_ = fVar70 * fVar98;
  auVar30._0_4_ = fVar137 * fVar97;
  auVar30._8_4_ = fVar137 * fVar223;
  auVar30._12_4_ = fVar70 * fVar122;
  auVar30._16_4_ = fVar137 * 0.0;
  auVar30._20_4_ = fVar70 * 0.0;
  auVar30._24_4_ = fVar137 * 0.0;
  auVar30._28_4_ = fVar139;
  auVar72 = vfmadd231ps_fma(auVar30,auVar93,local_558);
  auVar23 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar74));
  fVar137 = auVar73._0_4_;
  fVar138 = auVar73._4_4_;
  auVar31._4_4_ = fVar138 * fVar98;
  auVar31._0_4_ = fVar137 * fVar97;
  auVar31._8_4_ = fVar137 * fVar223;
  auVar31._12_4_ = fVar138 * fVar122;
  auVar31._16_4_ = fVar137 * 0.0;
  auVar31._20_4_ = fVar138 * 0.0;
  auVar31._24_4_ = fVar137 * 0.0;
  auVar31._28_4_ = fVar138;
  auVar73 = vfmadd231ps_fma(auVar31,auVar93,auVar203);
  auVar24 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar71));
  fVar137 = auVar282._0_4_;
  fVar138 = auVar282._4_4_;
  auVar32._4_4_ = fVar138 * fVar98;
  auVar32._0_4_ = fVar137 * fVar97;
  auVar32._8_4_ = fVar137 * fVar223;
  auVar32._12_4_ = fVar138 * fVar122;
  auVar32._16_4_ = fVar137 * 0.0;
  auVar32._20_4_ = fVar138 * 0.0;
  auVar32._24_4_ = fVar137 * 0.0;
  auVar32._28_4_ = fVar138;
  auVar282 = vfmadd231ps_fma(auVar32,auVar93,auVar320);
  auVar33._28_4_ = fVar70;
  auVar33._0_28_ =
       ZEXT1628(CONCAT412(auVar12._12_4_ * fVar122,
                          CONCAT48(auVar12._8_4_ * fVar223,
                                   CONCAT44(auVar12._4_4_ * fVar98,auVar12._0_4_ * fVar97))));
  auVar13 = vfmadd231ps_fma(auVar33,auVar93,ZEXT1632(auVar13));
  auVar85 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar122 * auVar72._12_4_,
                                               CONCAT48(fVar223 * auVar72._8_4_,
                                                        CONCAT44(fVar98 * auVar72._4_4_,
                                                                 fVar97 * auVar72._0_4_)))),auVar93,
                            ZEXT1632(auVar85));
  auVar120._0_4_ = auVar74._0_4_ + auVar288._0_4_;
  auVar120._4_4_ = auVar74._4_4_ + auVar288._4_4_;
  auVar120._8_4_ = auVar74._8_4_ + auVar288._8_4_;
  auVar120._12_4_ = auVar74._12_4_ + auVar288._12_4_;
  auVar120._16_4_ = auVar288._16_4_ + 0.0;
  auVar120._20_4_ = auVar288._20_4_ + 0.0;
  auVar120._24_4_ = auVar288._24_4_ + 0.0;
  auVar120._28_4_ = 0;
  auVar12 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar73._12_4_ * fVar122,
                                               CONCAT48(auVar73._8_4_ * fVar223,
                                                        CONCAT44(auVar73._4_4_ * fVar98,
                                                                 auVar73._0_4_ * fVar97)))),auVar93,
                            ZEXT1632(auVar12));
  auVar72 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar282._12_4_ * fVar122,
                                               CONCAT48(auVar282._8_4_ * fVar223,
                                                        CONCAT44(auVar282._4_4_ * fVar98,
                                                                 auVar282._0_4_ * fVar97)))),auVar93
                            ,ZEXT1632(auVar72));
  auVar73 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar122 * auVar12._12_4_,
                                               CONCAT48(fVar223 * auVar12._8_4_,
                                                        CONCAT44(fVar98 * auVar12._4_4_,
                                                                 fVar97 * auVar12._0_4_)))),auVar93,
                            ZEXT1632(auVar13));
  auVar282 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar72._12_4_ * fVar122,
                                                CONCAT48(auVar72._8_4_ * fVar223,
                                                         CONCAT44(auVar72._4_4_ * fVar98,
                                                                  auVar72._0_4_ * fVar97)))),
                             ZEXT1632(auVar85),auVar93);
  auVar93 = vsubps_avx(ZEXT1632(auVar12),ZEXT1632(auVar13));
  auVar20 = vsubps_avx(ZEXT1632(auVar72),ZEXT1632(auVar85));
  auVar311._0_4_ = fStack_c0 * auVar93._0_4_ * 3.0;
  auVar311._4_4_ = fStack_c0 * auVar93._4_4_ * 3.0;
  auVar311._8_4_ = fStack_c0 * auVar93._8_4_ * 3.0;
  auVar311._12_4_ = fStack_c0 * auVar93._12_4_ * 3.0;
  auVar311._16_4_ = fStack_c0 * auVar93._16_4_ * 3.0;
  auVar311._20_4_ = fStack_c0 * auVar93._20_4_ * 3.0;
  auVar311._24_4_ = fStack_c0 * auVar93._24_4_ * 3.0;
  auVar311._28_4_ = 0;
  local_d8 = fStack_c0 * auVar20._0_4_ * 3.0;
  fStack_d4 = fStack_c0 * auVar20._4_4_ * 3.0;
  auVar34._4_4_ = fStack_d4;
  auVar34._0_4_ = local_d8;
  fStack_d0 = fStack_c0 * auVar20._8_4_ * 3.0;
  auVar34._8_4_ = fStack_d0;
  fStack_cc = fStack_c0 * auVar20._12_4_ * 3.0;
  auVar34._12_4_ = fStack_cc;
  fStack_c8 = fStack_c0 * auVar20._16_4_ * 3.0;
  auVar34._16_4_ = fStack_c8;
  fStack_c4 = fStack_c0 * auVar20._20_4_ * 3.0;
  auVar34._20_4_ = fStack_c4;
  fStack_c0 = fStack_c0 * auVar20._24_4_ * 3.0;
  auVar34._24_4_ = fStack_c0;
  auVar34._28_4_ = 0x40400000;
  auVar25 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar73));
  local_3b8 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar282));
  auVar93 = vsubps_avx(ZEXT1632(auVar73),ZEXT1632(auVar74));
  auVar20 = vsubps_avx(ZEXT1632(auVar282),ZEXT1632(auVar71));
  auVar21 = vsubps_avx(auVar25,auVar23);
  fVar204 = auVar93._0_4_ + auVar21._0_4_;
  fVar168 = auVar93._4_4_ + auVar21._4_4_;
  fVar169 = auVar93._8_4_ + auVar21._8_4_;
  fVar219 = auVar93._12_4_ + auVar21._12_4_;
  fVar220 = auVar93._16_4_ + auVar21._16_4_;
  fVar221 = auVar93._20_4_ + auVar21._20_4_;
  fVar222 = auVar93._24_4_ + auVar21._24_4_;
  auVar22 = vsubps_avx(local_3b8,auVar24);
  auVar94._0_4_ = auVar20._0_4_ + auVar22._0_4_;
  auVar94._4_4_ = auVar20._4_4_ + auVar22._4_4_;
  auVar94._8_4_ = auVar20._8_4_ + auVar22._8_4_;
  auVar94._12_4_ = auVar20._12_4_ + auVar22._12_4_;
  auVar94._16_4_ = auVar20._16_4_ + auVar22._16_4_;
  auVar94._20_4_ = auVar20._20_4_ + auVar22._20_4_;
  auVar94._24_4_ = auVar20._24_4_ + auVar22._24_4_;
  auVar94._28_4_ = auVar20._28_4_ + auVar22._28_4_;
  local_78 = ZEXT1632(auVar71);
  fVar97 = auVar71._0_4_;
  local_f8 = (float)local_498._0_4_ + fVar97;
  fVar98 = auVar71._4_4_;
  fStack_f4 = (float)local_498._4_4_ + fVar98;
  fVar223 = auVar71._8_4_;
  fStack_f0 = fStack_490 + fVar223;
  fVar122 = auVar71._12_4_;
  fStack_ec = fStack_48c + fVar122;
  fStack_e8 = fStack_488 + 0.0;
  fStack_e4 = fStack_484 + 0.0;
  fStack_e0 = fStack_480 + 0.0;
  local_3d8 = ZEXT1632(auVar74);
  auVar20 = vsubps_avx(local_3d8,auVar288);
  local_358 = vpermps_avx2(_DAT_01fec480,auVar20);
  auVar20 = vsubps_avx(local_78,_local_498);
  local_118 = vpermps_avx2(_DAT_01fec480,auVar20);
  local_98._0_4_ = auVar73._0_4_ + auVar311._0_4_;
  local_98._4_4_ = auVar73._4_4_ + auVar311._4_4_;
  local_98._8_4_ = auVar73._8_4_ + auVar311._8_4_;
  local_98._12_4_ = auVar73._12_4_ + auVar311._12_4_;
  local_98._16_4_ = auVar311._16_4_ + 0.0;
  local_98._20_4_ = auVar311._20_4_ + 0.0;
  local_98._24_4_ = auVar311._24_4_ + 0.0;
  local_98._28_4_ = 0;
  auVar289 = ZEXT1632(auVar73);
  auVar20 = vsubps_avx(auVar289,auVar311);
  auVar26 = vpermps_avx2(_DAT_01fec480,auVar20);
  fVar137 = auVar282._0_4_;
  local_d8 = fVar137 + local_d8;
  fVar138 = auVar282._4_4_;
  fStack_d4 = fVar138 + fStack_d4;
  fVar139 = auVar282._8_4_;
  fStack_d0 = fVar139 + fStack_d0;
  fVar70 = auVar282._12_4_;
  fStack_cc = fVar70 + fStack_cc;
  fStack_c8 = fStack_c8 + 0.0;
  fStack_c4 = fStack_c4 + 0.0;
  fStack_c0 = fStack_c0 + 0.0;
  auVar20 = vsubps_avx(ZEXT1632(auVar282),auVar34);
  local_b8 = vpermps_avx2(_DAT_01fec480,auVar20);
  auVar35._4_4_ = fVar98 * fVar168;
  auVar35._0_4_ = fVar97 * fVar204;
  auVar35._8_4_ = fVar223 * fVar169;
  auVar35._12_4_ = fVar122 * fVar219;
  auVar35._16_4_ = fVar220 * 0.0;
  auVar35._20_4_ = fVar221 * 0.0;
  auVar35._24_4_ = fVar222 * 0.0;
  auVar35._28_4_ = auVar20._28_4_;
  auVar12 = vfnmadd231ps_fma(auVar35,local_3d8,auVar94);
  fStack_dc = fStack_47c + 0.0;
  auVar36._4_4_ = fStack_f4 * fVar168;
  auVar36._0_4_ = local_f8 * fVar204;
  auVar36._8_4_ = fStack_f0 * fVar169;
  auVar36._12_4_ = fStack_ec * fVar219;
  auVar36._16_4_ = fStack_e8 * fVar220;
  auVar36._20_4_ = fStack_e4 * fVar221;
  auVar36._24_4_ = fStack_e0 * fVar222;
  auVar36._28_4_ = 0;
  auVar13 = vfnmadd231ps_fma(auVar36,auVar94,auVar120);
  auVar37._4_4_ = local_118._4_4_ * fVar168;
  auVar37._0_4_ = local_118._0_4_ * fVar204;
  auVar37._8_4_ = local_118._8_4_ * fVar169;
  auVar37._12_4_ = local_118._12_4_ * fVar219;
  auVar37._16_4_ = local_118._16_4_ * fVar220;
  auVar37._20_4_ = local_118._20_4_ * fVar221;
  auVar37._24_4_ = local_118._24_4_ * fVar222;
  auVar37._28_4_ = fStack_47c + 0.0;
  auVar85 = vfnmadd231ps_fma(auVar37,local_358,auVar94);
  local_618._0_4_ = auVar24._0_4_;
  local_618._4_4_ = auVar24._4_4_;
  uStack_610._0_4_ = auVar24._8_4_;
  uStack_610._4_4_ = auVar24._12_4_;
  uStack_608._0_4_ = auVar24._16_4_;
  uStack_608._4_4_ = auVar24._20_4_;
  uStack_600._0_4_ = auVar24._24_4_;
  uStack_600._4_4_ = auVar24._28_4_;
  auVar38._4_4_ = (float)local_618._4_4_ * fVar168;
  auVar38._0_4_ = (float)local_618._0_4_ * fVar204;
  auVar38._8_4_ = (float)uStack_610 * fVar169;
  auVar38._12_4_ = uStack_610._4_4_ * fVar219;
  auVar38._16_4_ = (float)uStack_608 * fVar220;
  auVar38._20_4_ = uStack_608._4_4_ * fVar221;
  auVar38._24_4_ = (float)uStack_600 * fVar222;
  auVar38._28_4_ = uStack_600._4_4_;
  auVar72 = vfnmadd231ps_fma(auVar38,auVar23,auVar94);
  auVar237._0_4_ = fVar137 * fVar204;
  auVar237._4_4_ = fVar138 * fVar168;
  auVar237._8_4_ = fVar139 * fVar169;
  auVar237._12_4_ = fVar70 * fVar219;
  auVar237._16_4_ = fVar220 * 0.0;
  auVar237._20_4_ = fVar221 * 0.0;
  auVar237._24_4_ = fVar222 * 0.0;
  auVar237._28_4_ = 0;
  auVar73 = vfnmadd231ps_fma(auVar237,auVar289,auVar94);
  uStack_bc = 0x40400000;
  auVar39._4_4_ = fStack_d4 * fVar168;
  auVar39._0_4_ = local_d8 * fVar204;
  auVar39._8_4_ = fStack_d0 * fVar169;
  auVar39._12_4_ = fStack_cc * fVar219;
  auVar39._16_4_ = fStack_c8 * fVar220;
  auVar39._20_4_ = fStack_c4 * fVar221;
  auVar39._24_4_ = fStack_c0 * fVar222;
  auVar39._28_4_ = auVar23._28_4_;
  auVar71 = vfnmadd231ps_fma(auVar39,local_98,auVar94);
  auVar40._4_4_ = local_b8._4_4_ * fVar168;
  auVar40._0_4_ = local_b8._0_4_ * fVar204;
  auVar40._8_4_ = local_b8._8_4_ * fVar169;
  auVar40._12_4_ = local_b8._12_4_ * fVar219;
  auVar40._16_4_ = local_b8._16_4_ * fVar220;
  auVar40._20_4_ = local_b8._20_4_ * fVar221;
  auVar40._24_4_ = local_b8._24_4_ * fVar222;
  auVar40._28_4_ = local_b8._28_4_;
  auVar123 = vfnmadd231ps_fma(auVar40,auVar26,auVar94);
  auVar41._4_4_ = local_3b8._4_4_ * fVar168;
  auVar41._0_4_ = local_3b8._0_4_ * fVar204;
  auVar41._8_4_ = local_3b8._8_4_ * fVar169;
  auVar41._12_4_ = local_3b8._12_4_ * fVar219;
  auVar41._16_4_ = local_3b8._16_4_ * fVar220;
  auVar41._20_4_ = local_3b8._20_4_ * fVar221;
  auVar41._24_4_ = local_3b8._24_4_ * fVar222;
  auVar41._28_4_ = auVar93._28_4_ + auVar21._28_4_;
  auVar274 = vfnmadd231ps_fma(auVar41,auVar25,auVar94);
  auVar20 = vminps_avx(ZEXT1632(auVar12),ZEXT1632(auVar13));
  auVar93 = vmaxps_avx(ZEXT1632(auVar12),ZEXT1632(auVar13));
  auVar21 = vminps_avx(ZEXT1632(auVar85),ZEXT1632(auVar72));
  auVar21 = vminps_avx(auVar20,auVar21);
  auVar20 = vmaxps_avx(ZEXT1632(auVar85),ZEXT1632(auVar72));
  auVar93 = vmaxps_avx(auVar93,auVar20);
  auVar22 = vminps_avx(ZEXT1632(auVar73),ZEXT1632(auVar71));
  auVar20 = vmaxps_avx(ZEXT1632(auVar73),ZEXT1632(auVar71));
  auVar14 = vminps_avx(ZEXT1632(auVar123),ZEXT1632(auVar274));
  auVar22 = vminps_avx(auVar22,auVar14);
  auVar22 = vminps_avx(auVar21,auVar22);
  auVar21 = vmaxps_avx(ZEXT1632(auVar123),ZEXT1632(auVar274));
  auVar20 = vmaxps_avx(auVar20,auVar21);
  auVar20 = vmaxps_avx(auVar93,auVar20);
  auVar54._4_4_ = fStack_204;
  auVar54._0_4_ = local_208;
  auVar54._8_4_ = fStack_200;
  auVar54._12_4_ = fStack_1fc;
  auVar54._16_4_ = fStack_1f8;
  auVar54._20_4_ = fStack_1f4;
  auVar54._24_4_ = fStack_1f0;
  auVar54._28_4_ = fStack_1ec;
  auVar93 = vcmpps_avx(auVar22,auVar54,2);
  auVar52._4_4_ = fStack_224;
  auVar52._0_4_ = local_228;
  auVar52._8_4_ = fStack_220;
  auVar52._12_4_ = fStack_21c;
  auVar52._16_4_ = fStack_218;
  auVar52._20_4_ = fStack_214;
  auVar52._24_4_ = fStack_210;
  auVar52._28_4_ = fStack_20c;
  auVar20 = vcmpps_avx(auVar20,auVar52,5);
  auVar93 = vandps_avx(auVar20,auVar93);
  auVar20 = local_138 & auVar93;
  if ((((((((auVar20 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
           (auVar20 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar20 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         SUB321(auVar20 >> 0x7f,0) != '\0') ||
        (auVar20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
       SUB321(auVar20 >> 0xbf,0) != '\0') ||
      (auVar20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar20[0x1f] < '\0') {
    auVar20 = vsubps_avx(auVar23,local_3d8);
    auVar21 = vsubps_avx(auVar25,auVar289);
    fVar168 = auVar20._0_4_ + auVar21._0_4_;
    fVar169 = auVar20._4_4_ + auVar21._4_4_;
    fVar219 = auVar20._8_4_ + auVar21._8_4_;
    fVar220 = auVar20._12_4_ + auVar21._12_4_;
    fVar221 = auVar20._16_4_ + auVar21._16_4_;
    fVar222 = auVar20._20_4_ + auVar21._20_4_;
    fVar99 = auVar20._24_4_ + auVar21._24_4_;
    auVar22 = vsubps_avx(auVar24,local_78);
    auVar14 = vsubps_avx(local_3b8,ZEXT1632(auVar282));
    auVar121._0_4_ = auVar22._0_4_ + auVar14._0_4_;
    auVar121._4_4_ = auVar22._4_4_ + auVar14._4_4_;
    auVar121._8_4_ = auVar22._8_4_ + auVar14._8_4_;
    auVar121._12_4_ = auVar22._12_4_ + auVar14._12_4_;
    auVar121._16_4_ = auVar22._16_4_ + auVar14._16_4_;
    auVar121._20_4_ = auVar22._20_4_ + auVar14._20_4_;
    auVar121._24_4_ = auVar22._24_4_ + auVar14._24_4_;
    fVar204 = auVar14._28_4_;
    auVar121._28_4_ = auVar22._28_4_ + fVar204;
    auVar42._4_4_ = fVar98 * fVar169;
    auVar42._0_4_ = fVar97 * fVar168;
    auVar42._8_4_ = fVar223 * fVar219;
    auVar42._12_4_ = fVar122 * fVar220;
    auVar42._16_4_ = fVar221 * 0.0;
    auVar42._20_4_ = fVar222 * 0.0;
    auVar42._24_4_ = fVar99 * 0.0;
    auVar42._28_4_ = auVar25._28_4_;
    auVar73 = vfnmadd231ps_fma(auVar42,auVar121,local_3d8);
    auVar43._4_4_ = fVar169 * fStack_f4;
    auVar43._0_4_ = fVar168 * local_f8;
    auVar43._8_4_ = fVar219 * fStack_f0;
    auVar43._12_4_ = fVar220 * fStack_ec;
    auVar43._16_4_ = fVar221 * fStack_e8;
    auVar43._20_4_ = fVar222 * fStack_e4;
    auVar43._24_4_ = fVar99 * fStack_e0;
    auVar43._28_4_ = 0;
    auVar12 = vfnmadd213ps_fma(auVar120,auVar121,auVar43);
    auVar44._4_4_ = fVar169 * local_118._4_4_;
    auVar44._0_4_ = fVar168 * local_118._0_4_;
    auVar44._8_4_ = fVar219 * local_118._8_4_;
    auVar44._12_4_ = fVar220 * local_118._12_4_;
    auVar44._16_4_ = fVar221 * local_118._16_4_;
    auVar44._20_4_ = fVar222 * local_118._20_4_;
    auVar44._24_4_ = fVar99 * local_118._24_4_;
    auVar44._28_4_ = 0;
    auVar13 = vfnmadd213ps_fma(local_358,auVar121,auVar44);
    auVar45._4_4_ = (float)local_618._4_4_ * fVar169;
    auVar45._0_4_ = (float)local_618._0_4_ * fVar168;
    auVar45._8_4_ = (float)uStack_610 * fVar219;
    auVar45._12_4_ = uStack_610._4_4_ * fVar220;
    auVar45._16_4_ = (float)uStack_608 * fVar221;
    auVar45._20_4_ = uStack_608._4_4_ * fVar222;
    auVar45._24_4_ = (float)uStack_600 * fVar99;
    auVar45._28_4_ = 0;
    auVar282 = vfnmadd231ps_fma(auVar45,auVar121,auVar23);
    auVar153._0_4_ = fVar137 * fVar168;
    auVar153._4_4_ = fVar138 * fVar169;
    auVar153._8_4_ = fVar139 * fVar219;
    auVar153._12_4_ = fVar70 * fVar220;
    auVar153._16_4_ = fVar221 * 0.0;
    auVar153._20_4_ = fVar222 * 0.0;
    auVar153._24_4_ = fVar99 * 0.0;
    auVar153._28_4_ = 0;
    auVar71 = vfnmadd231ps_fma(auVar153,auVar121,auVar289);
    auVar46._4_4_ = fVar169 * fStack_d4;
    auVar46._0_4_ = fVar168 * local_d8;
    auVar46._8_4_ = fVar219 * fStack_d0;
    auVar46._12_4_ = fVar220 * fStack_cc;
    auVar46._16_4_ = fVar221 * fStack_c8;
    auVar46._20_4_ = fVar222 * fStack_c4;
    auVar46._24_4_ = fVar99 * fStack_c0;
    auVar46._28_4_ = fVar204;
    auVar85 = vfnmadd213ps_fma(local_98,auVar121,auVar46);
    auVar47._4_4_ = fVar169 * local_b8._4_4_;
    auVar47._0_4_ = fVar168 * local_b8._0_4_;
    auVar47._8_4_ = fVar219 * local_b8._8_4_;
    auVar47._12_4_ = fVar220 * local_b8._12_4_;
    auVar47._16_4_ = fVar221 * local_b8._16_4_;
    auVar47._20_4_ = fVar222 * local_b8._20_4_;
    auVar47._24_4_ = fVar99 * local_b8._24_4_;
    auVar47._28_4_ = fVar204;
    auVar72 = vfnmadd213ps_fma(auVar26,auVar121,auVar47);
    auVar48._4_4_ = local_3b8._4_4_ * fVar169;
    auVar48._0_4_ = local_3b8._0_4_ * fVar168;
    auVar48._8_4_ = local_3b8._8_4_ * fVar219;
    auVar48._12_4_ = local_3b8._12_4_ * fVar220;
    auVar48._16_4_ = local_3b8._16_4_ * fVar221;
    auVar48._20_4_ = local_3b8._20_4_ * fVar222;
    auVar48._24_4_ = local_3b8._24_4_ * fVar99;
    auVar48._28_4_ = auVar20._28_4_ + auVar21._28_4_;
    auVar123 = vfnmadd231ps_fma(auVar48,auVar25,auVar121);
    auVar21 = vminps_avx(ZEXT1632(auVar73),ZEXT1632(auVar12));
    auVar20 = vmaxps_avx(ZEXT1632(auVar73),ZEXT1632(auVar12));
    auVar22 = vminps_avx(ZEXT1632(auVar13),ZEXT1632(auVar282));
    auVar22 = vminps_avx(auVar21,auVar22);
    auVar21 = vmaxps_avx(ZEXT1632(auVar13),ZEXT1632(auVar282));
    auVar20 = vmaxps_avx(auVar20,auVar21);
    auVar14 = vminps_avx(ZEXT1632(auVar71),ZEXT1632(auVar85));
    auVar21 = vmaxps_avx(ZEXT1632(auVar71),ZEXT1632(auVar85));
    auVar23 = vminps_avx(ZEXT1632(auVar72),ZEXT1632(auVar123));
    auVar14 = vminps_avx(auVar14,auVar23);
    auVar14 = vminps_avx(auVar22,auVar14);
    auVar22 = vmaxps_avx(ZEXT1632(auVar72),ZEXT1632(auVar123));
    auVar21 = vmaxps_avx(auVar21,auVar22);
    auVar21 = vmaxps_avx(auVar20,auVar21);
    auVar55._4_4_ = fStack_204;
    auVar55._0_4_ = local_208;
    auVar55._8_4_ = fStack_200;
    auVar55._12_4_ = fStack_1fc;
    auVar55._16_4_ = fStack_1f8;
    auVar55._20_4_ = fStack_1f4;
    auVar55._24_4_ = fStack_1f0;
    auVar55._28_4_ = fStack_1ec;
    auVar20 = vcmpps_avx(auVar14,auVar55,2);
    auVar53._4_4_ = fStack_224;
    auVar53._0_4_ = local_228;
    auVar53._8_4_ = fStack_220;
    auVar53._12_4_ = fStack_21c;
    auVar53._16_4_ = fStack_218;
    auVar53._20_4_ = fStack_214;
    auVar53._24_4_ = fStack_210;
    auVar53._28_4_ = fStack_20c;
    auVar21 = vcmpps_avx(auVar21,auVar53,5);
    auVar20 = vandps_avx(auVar21,auVar20);
    auVar93 = vandps_avx(local_138,auVar93);
    auVar21 = auVar93 & auVar20;
    auVar321 = ZEXT864(0) << 0x20;
    if ((((((((auVar21 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar21 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar21 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar21 >> 0x7f,0) == '\0') &&
          (auVar21 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar21 >> 0xbf,0) == '\0') &&
        (auVar21 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar21[0x1f])
    goto LAB_016b0523;
    auVar93 = vandps_avx(auVar20,auVar93);
    uVar64 = vmovmskps_avx(auVar93);
    if (uVar64 == 0) goto LAB_016b0523;
    uVar59 = (ulong)uVar65;
    auStack_398[uVar59] = uVar64 & 0xff;
    uVar100 = vmovlps_avx(local_2c8);
    *(undefined8 *)(&uStack_1e8 + uVar59 * 2) = uVar100;
    uVar63 = vmovlps_avx(auVar176);
    auStack_58[uVar59] = uVar63;
    uVar65 = uVar65 + 1;
    goto LAB_016b0523;
  }
LAB_016b03cd:
  auVar321 = ZEXT1664(ZEXT816(0) << 0x40);
LAB_016b0523:
  if (uVar65 == 0) {
    if ((uVar58 & 1) != 0) goto LAB_016b14cc;
    uVar69 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar92._4_4_ = uVar69;
    auVar92._0_4_ = uVar69;
    auVar92._8_4_ = uVar69;
    auVar92._12_4_ = uVar69;
    auVar12 = vcmpps_avx(local_2d8,auVar92,2);
    uVar57 = vmovmskps_avx(auVar12);
    uVar56 = uVar56 & uVar56 + 0xf & uVar57;
    if (uVar56 == 0) goto LAB_016b14cc;
    goto LAB_016af368;
  }
  uVar59 = (ulong)(uVar65 - 1);
  uVar62 = auStack_398[uVar59];
  uVar64 = (&uStack_1e8)[uVar59 * 2];
  fVar97 = afStack_1e4[uVar59 * 2];
  iVar27 = 0;
  for (uVar63 = (ulong)uVar62; (uVar63 & 1) == 0; uVar63 = uVar63 >> 1 | 0x8000000000000000) {
    iVar27 = iVar27 + 1;
  }
  uVar62 = uVar62 - 1 & uVar62;
  if (uVar62 == 0) {
    uVar65 = uVar65 - 1;
  }
  auVar177._8_8_ = 0;
  auVar177._0_8_ = auStack_58[uVar59];
  auVar321 = ZEXT1664(auVar177);
  auStack_398[uVar59] = uVar62;
  fVar98 = (float)(iVar27 + 1) * 0.14285715;
  auVar12 = vfmadd231ss_fma(ZEXT416((uint)(fVar97 * (float)iVar27 * 0.14285715)),ZEXT416(uVar64),
                            ZEXT416((uint)(1.0 - (float)iVar27 * 0.14285715)));
  auVar13 = vfmadd231ss_fma(ZEXT416((uint)(fVar97 * fVar98)),ZEXT416(uVar64),
                            ZEXT416((uint)(1.0 - fVar98)));
  fVar98 = auVar13._0_4_;
  fVar223 = auVar12._0_4_;
  fVar97 = fVar98 - fVar223;
  if (0.16666667 <= fVar97) {
    auVar12 = vinsertps_avx(auVar12,auVar13,0x10);
    auVar290 = ZEXT1664(auVar12);
    goto LAB_016aff92;
  }
  auVar85 = vshufps_avx(auVar177,auVar177,0x50);
  auVar110._8_4_ = 0x3f800000;
  auVar110._0_8_ = 0x3f8000003f800000;
  auVar110._12_4_ = 0x3f800000;
  auVar72 = vsubps_avx(auVar110,auVar85);
  fVar122 = auVar85._0_4_;
  auVar161._0_4_ = fVar122 * fVar155;
  fVar137 = auVar85._4_4_;
  auVar161._4_4_ = fVar137 * fVar156;
  fVar138 = auVar85._8_4_;
  auVar161._8_4_ = fVar138 * fVar155;
  fVar139 = auVar85._12_4_;
  auVar161._12_4_ = fVar139 * fVar156;
  auVar178._0_4_ = fVar157 * fVar122;
  auVar178._4_4_ = fVar167 * fVar137;
  auVar178._8_4_ = fVar157 * fVar138;
  auVar178._12_4_ = fVar167 * fVar139;
  auVar200._0_4_ = fVar238 * fVar122;
  auVar200._4_4_ = fVar253 * fVar137;
  auVar200._8_4_ = fVar238 * fVar138;
  auVar200._12_4_ = fVar253 * fVar139;
  auVar82._0_4_ = fVar268 * fVar122;
  auVar82._4_4_ = fVar279 * fVar137;
  auVar82._8_4_ = fVar268 * fVar138;
  auVar82._12_4_ = fVar279 * fVar139;
  auVar85 = vfmadd231ps_fma(auVar161,auVar72,auVar230);
  auVar73 = vfmadd231ps_fma(auVar178,auVar72,auVar259);
  auVar282 = vfmadd231ps_fma(auVar200,auVar72,auVar294);
  auVar72 = vfmadd231ps_fma(auVar82,auVar72,auVar306);
  auVar154._16_16_ = auVar85;
  auVar154._0_16_ = auVar85;
  auVar166._16_16_ = auVar73;
  auVar166._0_16_ = auVar73;
  auVar186._16_16_ = auVar282;
  auVar186._0_16_ = auVar282;
  auVar218._4_4_ = fVar223;
  auVar218._0_4_ = fVar223;
  auVar218._8_4_ = fVar223;
  auVar218._12_4_ = fVar223;
  auVar218._20_4_ = fVar98;
  auVar218._16_4_ = fVar98;
  auVar218._24_4_ = fVar98;
  auVar218._28_4_ = fVar98;
  auVar93 = vsubps_avx(auVar166,auVar154);
  auVar73 = vfmadd213ps_fma(auVar93,auVar218,auVar154);
  auVar93 = vsubps_avx(auVar186,auVar166);
  auVar71 = vfmadd213ps_fma(auVar93,auVar218,auVar166);
  auVar85 = vsubps_avx(auVar72,auVar282);
  auVar95._16_16_ = auVar85;
  auVar95._0_16_ = auVar85;
  auVar85 = vfmadd213ps_fma(auVar95,auVar218,auVar186);
  auVar93 = vsubps_avx(ZEXT1632(auVar71),ZEXT1632(auVar73));
  auVar72 = vfmadd213ps_fma(auVar93,auVar218,ZEXT1632(auVar73));
  auVar93 = vsubps_avx(ZEXT1632(auVar85),ZEXT1632(auVar71));
  auVar85 = vfmadd213ps_fma(auVar93,auVar218,ZEXT1632(auVar71));
  auVar93 = vsubps_avx(ZEXT1632(auVar85),ZEXT1632(auVar72));
  auVar124 = vfmadd231ps_fma(ZEXT1632(auVar72),auVar93,auVar218);
  fVar122 = fVar97 * 0.33333334;
  auVar213._0_8_ =
       CONCAT44(auVar124._4_4_ + fVar122 * auVar93._4_4_ * 3.0,
                auVar124._0_4_ + fVar122 * auVar93._0_4_ * 3.0);
  auVar213._8_4_ = auVar124._8_4_ + fVar122 * auVar93._8_4_ * 3.0;
  auVar213._12_4_ = auVar124._12_4_ + fVar122 * auVar93._12_4_ * 3.0;
  auVar72 = vshufpd_avx(auVar124,auVar124,3);
  auVar73 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
  auVar85 = vsubps_avx(auVar72,auVar124);
  auVar282 = vsubps_avx(auVar73,(undefined1  [16])0x0);
  auVar83._0_4_ = auVar85._0_4_ + auVar282._0_4_;
  auVar83._4_4_ = auVar85._4_4_ + auVar282._4_4_;
  auVar83._8_4_ = auVar85._8_4_ + auVar282._8_4_;
  auVar83._12_4_ = auVar85._12_4_ + auVar282._12_4_;
  auVar85 = vshufps_avx(auVar124,auVar124,0xb1);
  auVar282 = vshufps_avx(auVar213,auVar213,0xb1);
  auVar307._4_4_ = auVar83._0_4_;
  auVar307._0_4_ = auVar83._0_4_;
  auVar307._8_4_ = auVar83._0_4_;
  auVar307._12_4_ = auVar83._0_4_;
  auVar71 = vshufps_avx(auVar83,auVar83,0x55);
  fVar137 = auVar71._0_4_;
  auVar84._0_4_ = fVar137 * auVar85._0_4_;
  fVar138 = auVar71._4_4_;
  auVar84._4_4_ = fVar138 * auVar85._4_4_;
  fVar139 = auVar71._8_4_;
  auVar84._8_4_ = fVar139 * auVar85._8_4_;
  fVar70 = auVar71._12_4_;
  auVar84._12_4_ = fVar70 * auVar85._12_4_;
  auVar179._0_4_ = fVar137 * auVar282._0_4_;
  auVar179._4_4_ = fVar138 * auVar282._4_4_;
  auVar179._8_4_ = fVar139 * auVar282._8_4_;
  auVar179._12_4_ = fVar70 * auVar282._12_4_;
  auVar123 = vfmadd231ps_fma(auVar84,auVar307,auVar124);
  local_3b8._0_16_ = auVar213;
  auVar274 = vfmadd231ps_fma(auVar179,auVar307,auVar213);
  auVar282 = vshufps_avx(auVar123,auVar123,0xe8);
  auVar71 = vshufps_avx(auVar274,auVar274,0xe8);
  auVar85 = vcmpps_avx(auVar282,auVar71,1);
  uVar64 = vextractps_avx(auVar85,0);
  auVar74 = auVar274;
  if ((uVar64 & 1) == 0) {
    auVar74 = auVar123;
  }
  auVar146._0_4_ = fVar122 * auVar93._16_4_ * 3.0;
  auVar146._4_4_ = fVar122 * auVar93._20_4_ * 3.0;
  auVar146._8_4_ = fVar122 * auVar93._24_4_ * 3.0;
  auVar146._12_4_ = fVar122 * 0.0;
  auVar187 = vsubps_avx((undefined1  [16])0x0,auVar146);
  auVar147 = vshufps_avx(auVar187,auVar187,0xb1);
  auVar170 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
  auVar214._0_4_ = fVar137 * auVar147._0_4_;
  auVar214._4_4_ = fVar138 * auVar147._4_4_;
  auVar214._8_4_ = fVar139 * auVar147._8_4_;
  auVar214._12_4_ = fVar70 * auVar147._12_4_;
  auVar231._0_4_ = auVar170._0_4_ * fVar137;
  auVar231._4_4_ = auVar170._4_4_ * fVar138;
  auVar231._8_4_ = auVar170._8_4_ * fVar139;
  auVar231._12_4_ = auVar170._12_4_ * fVar70;
  local_3d8._0_16_ = auVar187;
  auVar205 = vfmadd231ps_fma(auVar214,auVar307,auVar187);
  auVar206 = vfmadd231ps_fma(auVar231,(undefined1  [16])0x0,auVar307);
  auVar170 = vshufps_avx(auVar205,auVar205,0xe8);
  auVar176 = vshufps_avx(auVar206,auVar206,0xe8);
  auVar147 = vcmpps_avx(auVar170,auVar176,1);
  uVar64 = vextractps_avx(auVar147,0);
  auVar224 = auVar206;
  if ((uVar64 & 1) == 0) {
    auVar224 = auVar205;
  }
  auVar74 = vmaxss_avx(auVar224,auVar74);
  auVar282 = vminps_avx(auVar282,auVar71);
  auVar71 = vminps_avx(auVar170,auVar176);
  auVar71 = vminps_avx(auVar282,auVar71);
  auVar85 = vshufps_avx(auVar85,auVar85,0x55);
  auVar85 = vblendps_avx(auVar85,auVar147,2);
  auVar147 = vpslld_avx(auVar85,0x1f);
  auVar85 = vshufpd_avx(auVar274,auVar274,1);
  auVar85 = vinsertps_avx(auVar85,auVar206,0x9c);
  auVar282 = vshufpd_avx(auVar123,auVar123,1);
  auVar282 = vinsertps_avx(auVar282,auVar205,0x9c);
  auVar85 = vblendvps_avx(auVar282,auVar85,auVar147);
  auVar282 = vmovshdup_avx(auVar85);
  auVar85 = vmaxss_avx(auVar282,auVar85);
  fVar139 = auVar71._0_4_;
  auVar282 = vmovshdup_avx(auVar71);
  fVar138 = auVar85._0_4_;
  fVar122 = auVar282._0_4_;
  fVar137 = auVar74._0_4_;
  if (((0.0001 <= fVar139) || (fVar138 <= -0.0001)) && (0.0001 <= fVar122 || fVar138 <= -0.0001)) {
    auVar282 = vcmpps_avx(auVar282,SUB6416(ZEXT464(0x38d1b717),0),5);
    auVar123 = vcmpps_avx(auVar71,SUB6416(ZEXT464(0x38d1b717),0),5);
    auVar282 = vandps_avx(auVar123,auVar282);
    if (fVar137 <= -0.0001 || (auVar282 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
    goto LAB_016b03cd;
  }
  auVar123 = vcmpps_avx(auVar71,_DAT_01f7aa10,1);
  auVar274 = SUB6416(ZEXT864(0),0) << 0x20;
  auVar282 = vcmpss_avx(auVar74,ZEXT816(0) << 0x20,1);
  auVar128._8_4_ = 0xbf800000;
  auVar128._0_8_ = 0xbf800000bf800000;
  auVar128._12_4_ = 0xbf800000;
  auVar282 = vblendvps_avx(auVar110,auVar128,auVar282);
  auVar123 = vblendvps_avx(auVar110,auVar128,auVar123);
  fVar204 = auVar123._0_4_;
  fVar70 = auVar282._0_4_;
  auVar282 = SUB6416(ZEXT864(0),0) << 0x20;
  if ((fVar204 == fVar70) && (!NAN(fVar204) && !NAN(fVar70))) {
    auVar282 = SUB6416(ZEXT464(0x7f800000),0);
  }
  if ((fVar204 == fVar70) && (!NAN(fVar204) && !NAN(fVar70))) {
    auVar274 = SUB6416(ZEXT464(0xff800000),0);
  }
  auVar123 = vmovshdup_avx(auVar123);
  fVar168 = auVar123._0_4_;
  if ((fVar204 != fVar168) || (NAN(fVar204) || NAN(fVar168))) {
    if ((fVar122 != fVar139) || (NAN(fVar122) || NAN(fVar139))) {
      auVar148._0_8_ = auVar71._0_8_ ^ 0x8000000080000000;
      auVar148._8_4_ = auVar71._8_4_ ^ 0x80000000;
      auVar148._12_4_ = auVar71._12_4_ ^ 0x80000000;
      auVar149._0_4_ = -fVar139 / (fVar122 - fVar139);
      auVar149._4_12_ = auVar148._4_12_;
      auVar51._12_4_ = 0;
      auVar51._0_12_ = ZEXT812(0);
      auVar321 = ZEXT1264(ZEXT812(0)) << 0x20;
      auVar71 = vfmadd213ss_fma(ZEXT416((uint)(1.0 - auVar149._0_4_)),auVar51 << 0x20,auVar149);
      auVar123 = auVar71;
    }
    else {
      auVar71 = ZEXT816(0) << 0x20;
      auVar321 = ZEXT1264(ZEXT812(0)) << 0x20;
      if ((fVar139 != 0.0) || (auVar123 = SUB6416(ZEXT464(0x3f800000),0), NAN(fVar139))) {
        auVar71 = SUB6416(ZEXT464(0x7f800000),0);
        auVar123 = SUB6416(ZEXT464(0xff800000),0);
      }
    }
    auVar282 = vminss_avx(auVar282,auVar71);
    auVar274 = vmaxss_avx(auVar123,auVar274);
  }
  else {
    auVar321 = ZEXT1264(ZEXT812(0)) << 0x20;
  }
  auVar71 = auVar321._0_16_;
  auVar85 = vcmpss_avx(auVar85,auVar71,1);
  auVar129._8_4_ = 0xbf800000;
  auVar129._0_8_ = 0xbf800000bf800000;
  auVar129._12_4_ = 0xbf800000;
  auVar85 = vblendvps_avx(auVar110,auVar129,auVar85);
  fVar122 = auVar85._0_4_;
  if ((fVar70 != fVar122) || (NAN(fVar70) || NAN(fVar122))) {
    if ((fVar138 != fVar137) || (NAN(fVar138) || NAN(fVar137))) {
      auVar86._0_8_ = auVar74._0_8_ ^ 0x8000000080000000;
      auVar86._8_4_ = auVar74._8_4_ ^ 0x80000000;
      auVar86._12_4_ = auVar74._12_4_ ^ 0x80000000;
      auVar150._0_4_ = -fVar137 / (fVar138 - fVar137);
      auVar150._4_12_ = auVar86._4_12_;
      auVar85 = vfmadd213ss_fma(ZEXT416((uint)(1.0 - auVar150._0_4_)),auVar71,auVar150);
      auVar123 = auVar85;
    }
    else {
      auVar85 = ZEXT816(0) << 0x20;
      if ((fVar137 != 0.0) || (auVar123 = SUB6416(ZEXT464(0x3f800000),0), NAN(fVar137))) {
        auVar85 = SUB6416(ZEXT464(0x7f800000),0);
        auVar123 = SUB6416(ZEXT464(0xff800000),0);
      }
    }
    auVar282 = vminss_avx(auVar282,auVar85);
    auVar274 = vmaxss_avx(auVar123,auVar274);
  }
  auVar85 = SUB6416(ZEXT464(0x3f800000),0);
  if ((fVar168 != fVar122) || (NAN(fVar168) || NAN(fVar122))) {
    auVar282 = vminss_avx(auVar282,auVar85);
    auVar274 = vmaxss_avx(auVar85,auVar274);
  }
  auVar282 = vmaxss_avx(auVar71,auVar282);
  auVar123 = vminss_avx(auVar274,auVar85);
  if (auVar282._0_4_ <= auVar123._0_4_) {
    auVar282 = vmaxss_avx(auVar71,ZEXT416((uint)(auVar282._0_4_ + -0.1)));
    auVar85 = vminss_avx(ZEXT416((uint)(auVar123._0_4_ + 0.1)),auVar85);
    auVar162._0_8_ = auVar124._0_8_;
    auVar162._8_8_ = auVar162._0_8_;
    auVar245._8_8_ = auVar213._0_8_;
    auVar245._0_8_ = auVar213._0_8_;
    auVar260._8_8_ = auVar187._0_8_;
    auVar260._0_8_ = auVar187._0_8_;
    auVar71 = vshufpd_avx(auVar213,auVar213,3);
    auVar123 = vshufpd_avx(auVar187,auVar187,3);
    auVar274 = vshufps_avx(auVar282,auVar85,0);
    auVar124 = vsubps_avx(auVar110,auVar274);
    local_498._0_4_ = auVar72._0_4_;
    local_498._4_4_ = auVar72._4_4_;
    fStack_490 = auVar72._8_4_;
    fStack_48c = auVar72._12_4_;
    fVar122 = auVar274._0_4_;
    auVar87._0_4_ = fVar122 * (float)local_498._0_4_;
    fVar137 = auVar274._4_4_;
    auVar87._4_4_ = fVar137 * (float)local_498._4_4_;
    fVar138 = auVar274._8_4_;
    auVar87._8_4_ = fVar138 * fStack_490;
    fVar139 = auVar274._12_4_;
    auVar87._12_4_ = fVar139 * fStack_48c;
    auVar201._0_4_ = fVar122 * auVar71._0_4_;
    auVar201._4_4_ = fVar137 * auVar71._4_4_;
    auVar201._8_4_ = fVar138 * auVar71._8_4_;
    auVar201._12_4_ = fVar139 * auVar71._12_4_;
    auVar215._0_4_ = fVar122 * auVar123._0_4_;
    auVar215._4_4_ = fVar137 * auVar123._4_4_;
    auVar215._8_4_ = fVar138 * auVar123._8_4_;
    auVar215._12_4_ = fVar139 * auVar123._12_4_;
    local_478 = auVar73._0_4_;
    fStack_474 = auVar73._4_4_;
    fStack_470 = auVar73._8_4_;
    fStack_46c = auVar73._12_4_;
    auVar232._0_4_ = fVar122 * local_478;
    auVar232._4_4_ = fVar137 * fStack_474;
    auVar232._8_4_ = fVar138 * fStack_470;
    auVar232._12_4_ = fVar139 * fStack_46c;
    auVar71 = vfmadd231ps_fma(auVar87,auVar124,auVar162);
    auVar123 = vfmadd231ps_fma(auVar201,auVar124,auVar245);
    auVar274 = vfmadd231ps_fma(auVar215,auVar124,auVar260);
    auVar124 = vfmadd231ps_fma(auVar232,auVar124,ZEXT816(0));
    auVar72 = vmovshdup_avx(auVar177);
    auVar187 = vfmadd231ss_fma(ZEXT416((uint)(auVar72._0_4_ * auVar282._0_4_)),auVar177,
                               ZEXT416((uint)(1.0 - auVar282._0_4_)));
    auVar205 = vfmadd231ss_fma(ZEXT416((uint)(auVar72._0_4_ * auVar85._0_4_)),auVar177,
                               ZEXT416((uint)(1.0 - auVar85._0_4_)));
    fVar122 = 1.0 / fVar97;
    auVar85 = vsubps_avx(auVar123,auVar71);
    auVar246._0_4_ = auVar85._0_4_ * 3.0;
    auVar246._4_4_ = auVar85._4_4_ * 3.0;
    auVar246._8_4_ = auVar85._8_4_ * 3.0;
    auVar246._12_4_ = auVar85._12_4_ * 3.0;
    auVar85 = vsubps_avx(auVar274,auVar123);
    auVar261._0_4_ = auVar85._0_4_ * 3.0;
    auVar261._4_4_ = auVar85._4_4_ * 3.0;
    auVar261._8_4_ = auVar85._8_4_ * 3.0;
    auVar261._12_4_ = auVar85._12_4_ * 3.0;
    auVar85 = vsubps_avx(auVar124,auVar274);
    auVar275._0_4_ = auVar85._0_4_ * 3.0;
    auVar275._4_4_ = auVar85._4_4_ * 3.0;
    auVar275._8_4_ = auVar85._8_4_ * 3.0;
    auVar275._12_4_ = auVar85._12_4_ * 3.0;
    auVar72 = vminps_avx(auVar261,auVar275);
    auVar85 = vmaxps_avx(auVar261,auVar275);
    auVar72 = vminps_avx(auVar246,auVar72);
    auVar85 = vmaxps_avx(auVar246,auVar85);
    auVar73 = vshufpd_avx(auVar72,auVar72,3);
    auVar282 = vshufpd_avx(auVar85,auVar85,3);
    auVar72 = vminps_avx(auVar72,auVar73);
    auVar85 = vmaxps_avx(auVar85,auVar282);
    auVar262._0_4_ = auVar72._0_4_ * fVar122;
    auVar262._4_4_ = auVar72._4_4_ * fVar122;
    auVar262._8_4_ = auVar72._8_4_ * fVar122;
    auVar262._12_4_ = auVar72._12_4_ * fVar122;
    auVar247._0_4_ = auVar85._0_4_ * fVar122;
    auVar247._4_4_ = auVar85._4_4_ * fVar122;
    auVar247._8_4_ = auVar85._8_4_ * fVar122;
    auVar247._12_4_ = auVar85._12_4_ * fVar122;
    fVar122 = 1.0 / (auVar205._0_4_ - auVar187._0_4_);
    auVar85 = vshufpd_avx(auVar71,auVar71,3);
    auVar72 = vshufpd_avx(auVar123,auVar123,3);
    auVar73 = vshufpd_avx(auVar274,auVar274,3);
    auVar282 = vshufpd_avx(auVar124,auVar124,3);
    auVar85 = vsubps_avx(auVar85,auVar71);
    auVar71 = vsubps_avx(auVar72,auVar123);
    auVar123 = vsubps_avx(auVar73,auVar274);
    auVar282 = vsubps_avx(auVar282,auVar124);
    auVar72 = vminps_avx(auVar85,auVar71);
    auVar85 = vmaxps_avx(auVar85,auVar71);
    auVar73 = vminps_avx(auVar123,auVar282);
    auVar73 = vminps_avx(auVar72,auVar73);
    auVar72 = vmaxps_avx(auVar123,auVar282);
    auVar85 = vmaxps_avx(auVar85,auVar72);
    auVar295._0_4_ = fVar122 * auVar73._0_4_;
    auVar295._4_4_ = fVar122 * auVar73._4_4_;
    auVar295._8_4_ = fVar122 * auVar73._8_4_;
    auVar295._12_4_ = fVar122 * auVar73._12_4_;
    auVar283._0_4_ = fVar122 * auVar85._0_4_;
    auVar283._4_4_ = fVar122 * auVar85._4_4_;
    auVar283._8_4_ = fVar122 * auVar85._8_4_;
    auVar283._12_4_ = fVar122 * auVar85._12_4_;
    auVar282 = vinsertps_avx(auVar12,auVar187,0x10);
    auVar71 = vinsertps_avx(auVar13,auVar205,0x10);
    auVar276._0_4_ = (auVar282._0_4_ + auVar71._0_4_) * 0.5;
    auVar276._4_4_ = (auVar282._4_4_ + auVar71._4_4_) * 0.5;
    auVar276._8_4_ = (auVar282._8_4_ + auVar71._8_4_) * 0.5;
    auVar276._12_4_ = (auVar282._12_4_ + auVar71._12_4_) * 0.5;
    auVar88._4_4_ = auVar276._0_4_;
    auVar88._0_4_ = auVar276._0_4_;
    auVar88._8_4_ = auVar276._0_4_;
    auVar88._12_4_ = auVar276._0_4_;
    auVar85 = vfmadd213ps_fma(local_238,auVar88,auVar15);
    auVar72 = vfmadd213ps_fma(local_248,auVar88,auVar16);
    auVar73 = vfmadd213ps_fma(local_258,auVar88,auVar17);
    auVar13 = vsubps_avx(auVar72,auVar85);
    auVar85 = vfmadd213ps_fma(auVar13,auVar88,auVar85);
    auVar13 = vsubps_avx(auVar73,auVar72);
    auVar13 = vfmadd213ps_fma(auVar13,auVar88,auVar72);
    auVar13 = vsubps_avx(auVar13,auVar85);
    auVar85 = vfmadd231ps_fma(auVar85,auVar13,auVar88);
    auVar89._0_8_ = CONCAT44(auVar13._4_4_ * 3.0,auVar13._0_4_ * 3.0);
    auVar89._8_4_ = auVar13._8_4_ * 3.0;
    auVar89._12_4_ = auVar13._12_4_ * 3.0;
    auVar308._8_8_ = auVar85._0_8_;
    auVar308._0_8_ = auVar85._0_8_;
    auVar13 = vshufpd_avx(auVar85,auVar85,3);
    auVar85 = vshufps_avx(auVar276,auVar276,0x55);
    auVar274 = vsubps_avx(auVar13,auVar308);
    auVar74 = vfmadd231ps_fma(auVar308,auVar85,auVar274);
    auVar317._8_8_ = auVar89._0_8_;
    auVar317._0_8_ = auVar89._0_8_;
    auVar13 = vshufpd_avx(auVar89,auVar89,3);
    auVar13 = vsubps_avx(auVar13,auVar317);
    auVar124 = vfmadd213ps_fma(auVar13,auVar85,auVar317);
    auVar85 = vmovshdup_avx(auVar124);
    auVar318._0_8_ = auVar85._0_8_ ^ 0x8000000080000000;
    auVar318._8_4_ = auVar85._8_4_ ^ 0x80000000;
    auVar318._12_4_ = auVar85._12_4_ ^ 0x80000000;
    auVar72 = vmovshdup_avx(auVar274);
    auVar13 = vunpcklps_avx(auVar72,auVar318);
    auVar73 = vshufps_avx(auVar13,auVar318,4);
    auVar123 = vshufps_avx(auVar276,auVar276,0x54);
    auVar151._0_8_ = auVar274._0_8_ ^ 0x8000000080000000;
    auVar151._8_4_ = auVar274._8_4_ ^ 0x80000000;
    auVar151._12_4_ = auVar274._12_4_ ^ 0x80000000;
    auVar13 = vmovlhps_avx(auVar151,auVar124);
    auVar13 = vshufps_avx(auVar13,auVar124,8);
    auVar85 = vfmsub231ss_fma(ZEXT416((uint)(auVar274._0_4_ * auVar85._0_4_)),auVar72,auVar124);
    uVar69 = auVar85._0_4_;
    auVar90._4_4_ = uVar69;
    auVar90._0_4_ = uVar69;
    auVar90._8_4_ = uVar69;
    auVar90._12_4_ = uVar69;
    auVar85 = vdivps_avx(auVar73,auVar90);
    auVar72 = vdivps_avx(auVar13,auVar90);
    fVar138 = auVar74._0_4_;
    fVar122 = auVar85._0_4_;
    auVar13 = vshufps_avx(auVar74,auVar74,0x55);
    fVar137 = auVar72._0_4_;
    auVar91._0_4_ = fVar138 * fVar122 + auVar13._0_4_ * fVar137;
    auVar91._4_4_ = fVar138 * auVar85._4_4_ + auVar13._4_4_ * auVar72._4_4_;
    auVar91._8_4_ = fVar138 * auVar85._8_4_ + auVar13._8_4_ * auVar72._8_4_;
    auVar91._12_4_ = fVar138 * auVar85._12_4_ + auVar13._12_4_ * auVar72._12_4_;
    auVar176 = vsubps_avx(auVar123,auVar91);
    auVar123 = vmovshdup_avx(auVar85);
    auVar13 = vinsertps_avx(auVar262,auVar295,0x1c);
    auVar180._0_4_ = auVar123._0_4_ * auVar13._0_4_;
    auVar180._4_4_ = auVar123._4_4_ * auVar13._4_4_;
    auVar180._8_4_ = auVar123._8_4_ * auVar13._8_4_;
    auVar180._12_4_ = auVar123._12_4_ * auVar13._12_4_;
    auVar73 = vinsertps_avx(auVar247,auVar283,0x1c);
    auVar111._0_4_ = auVar73._0_4_ * auVar123._0_4_;
    auVar111._4_4_ = auVar73._4_4_ * auVar123._4_4_;
    auVar111._8_4_ = auVar73._8_4_ * auVar123._8_4_;
    auVar111._12_4_ = auVar73._12_4_ * auVar123._12_4_;
    auVar74 = vminps_avx(auVar180,auVar111);
    auVar124 = vmaxps_avx(auVar111,auVar180);
    auVar123 = vinsertps_avx(auVar295,auVar262,0x4c);
    auVar147 = vmovshdup_avx(auVar72);
    auVar274 = vinsertps_avx(auVar283,auVar247,0x4c);
    auVar284._0_4_ = auVar147._0_4_ * auVar123._0_4_;
    auVar284._4_4_ = auVar147._4_4_ * auVar123._4_4_;
    auVar284._8_4_ = auVar147._8_4_ * auVar123._8_4_;
    auVar284._12_4_ = auVar147._12_4_ * auVar123._12_4_;
    auVar263._0_4_ = auVar147._0_4_ * auVar274._0_4_;
    auVar263._4_4_ = auVar147._4_4_ * auVar274._4_4_;
    auVar263._8_4_ = auVar147._8_4_ * auVar274._8_4_;
    auVar263._12_4_ = auVar147._12_4_ * auVar274._12_4_;
    auVar147 = vminps_avx(auVar284,auVar263);
    auVar296._0_4_ = auVar74._0_4_ + auVar147._0_4_;
    auVar296._4_4_ = auVar74._4_4_ + auVar147._4_4_;
    auVar296._8_4_ = auVar74._8_4_ + auVar147._8_4_;
    auVar296._12_4_ = auVar74._12_4_ + auVar147._12_4_;
    auVar74 = vmaxps_avx(auVar263,auVar284);
    auVar112._0_4_ = auVar74._0_4_ + auVar124._0_4_;
    auVar112._4_4_ = auVar74._4_4_ + auVar124._4_4_;
    auVar112._8_4_ = auVar74._8_4_ + auVar124._8_4_;
    auVar112._12_4_ = auVar74._12_4_ + auVar124._12_4_;
    auVar264._8_8_ = 0x3f80000000000000;
    auVar264._0_8_ = 0x3f80000000000000;
    auVar124 = vsubps_avx(auVar264,auVar112);
    auVar74 = vsubps_avx(auVar264,auVar296);
    auVar147 = vsubps_avx(auVar282,auVar276);
    auVar170 = vsubps_avx(auVar71,auVar276);
    auVar130._0_4_ = fVar122 * auVar13._0_4_;
    auVar130._4_4_ = fVar122 * auVar13._4_4_;
    auVar130._8_4_ = fVar122 * auVar13._8_4_;
    auVar130._12_4_ = fVar122 * auVar13._12_4_;
    auVar297._0_4_ = fVar122 * auVar73._0_4_;
    auVar297._4_4_ = fVar122 * auVar73._4_4_;
    auVar297._8_4_ = fVar122 * auVar73._8_4_;
    auVar297._12_4_ = fVar122 * auVar73._12_4_;
    auVar73 = vminps_avx(auVar130,auVar297);
    auVar13 = vmaxps_avx(auVar297,auVar130);
    auVar181._0_4_ = fVar137 * auVar123._0_4_;
    auVar181._4_4_ = fVar137 * auVar123._4_4_;
    auVar181._8_4_ = fVar137 * auVar123._8_4_;
    auVar181._12_4_ = fVar137 * auVar123._12_4_;
    auVar248._0_4_ = fVar137 * auVar274._0_4_;
    auVar248._4_4_ = fVar137 * auVar274._4_4_;
    auVar248._8_4_ = fVar137 * auVar274._8_4_;
    auVar248._12_4_ = fVar137 * auVar274._12_4_;
    auVar123 = vminps_avx(auVar181,auVar248);
    auVar298._0_4_ = auVar73._0_4_ + auVar123._0_4_;
    auVar298._4_4_ = auVar73._4_4_ + auVar123._4_4_;
    auVar298._8_4_ = auVar73._8_4_ + auVar123._8_4_;
    auVar298._12_4_ = auVar73._12_4_ + auVar123._12_4_;
    fVar168 = auVar147._0_4_;
    auVar309._0_4_ = fVar168 * auVar124._0_4_;
    fVar169 = auVar147._4_4_;
    auVar309._4_4_ = fVar169 * auVar124._4_4_;
    fVar219 = auVar147._8_4_;
    auVar309._8_4_ = fVar219 * auVar124._8_4_;
    fVar220 = auVar147._12_4_;
    auVar309._12_4_ = fVar220 * auVar124._12_4_;
    auVar73 = vmaxps_avx(auVar248,auVar181);
    auVar249._0_4_ = fVar168 * auVar74._0_4_;
    auVar249._4_4_ = fVar169 * auVar74._4_4_;
    auVar249._8_4_ = fVar219 * auVar74._8_4_;
    auVar249._12_4_ = fVar220 * auVar74._12_4_;
    fVar138 = auVar170._0_4_;
    auVar113._0_4_ = fVar138 * auVar124._0_4_;
    fVar139 = auVar170._4_4_;
    auVar113._4_4_ = fVar139 * auVar124._4_4_;
    fVar70 = auVar170._8_4_;
    auVar113._8_4_ = fVar70 * auVar124._8_4_;
    fVar204 = auVar170._12_4_;
    auVar113._12_4_ = fVar204 * auVar124._12_4_;
    auVar265._0_4_ = fVar138 * auVar74._0_4_;
    auVar265._4_4_ = fVar139 * auVar74._4_4_;
    auVar265._8_4_ = fVar70 * auVar74._8_4_;
    auVar265._12_4_ = fVar204 * auVar74._12_4_;
    auVar131._0_4_ = auVar13._0_4_ + auVar73._0_4_;
    auVar131._4_4_ = auVar13._4_4_ + auVar73._4_4_;
    auVar131._8_4_ = auVar13._8_4_ + auVar73._8_4_;
    auVar131._12_4_ = auVar13._12_4_ + auVar73._12_4_;
    auVar182._8_8_ = 0x3f800000;
    auVar182._0_8_ = 0x3f800000;
    auVar13 = vsubps_avx(auVar182,auVar131);
    auVar73 = vsubps_avx(auVar182,auVar298);
    auVar299._0_4_ = fVar168 * auVar13._0_4_;
    auVar299._4_4_ = fVar169 * auVar13._4_4_;
    auVar299._8_4_ = fVar219 * auVar13._8_4_;
    auVar299._12_4_ = fVar220 * auVar13._12_4_;
    auVar285._0_4_ = fVar168 * auVar73._0_4_;
    auVar285._4_4_ = fVar169 * auVar73._4_4_;
    auVar285._8_4_ = fVar219 * auVar73._8_4_;
    auVar285._12_4_ = fVar220 * auVar73._12_4_;
    auVar132._0_4_ = fVar138 * auVar13._0_4_;
    auVar132._4_4_ = fVar139 * auVar13._4_4_;
    auVar132._8_4_ = fVar70 * auVar13._8_4_;
    auVar132._12_4_ = fVar204 * auVar13._12_4_;
    auVar183._0_4_ = fVar138 * auVar73._0_4_;
    auVar183._4_4_ = fVar139 * auVar73._4_4_;
    auVar183._8_4_ = fVar70 * auVar73._8_4_;
    auVar183._12_4_ = fVar204 * auVar73._12_4_;
    auVar13 = vminps_avx(auVar299,auVar285);
    auVar73 = vminps_avx(auVar132,auVar183);
    auVar13 = vminps_avx(auVar13,auVar73);
    auVar73 = vmaxps_avx(auVar285,auVar299);
    auVar123 = vmaxps_avx(auVar183,auVar132);
    auVar274 = vminps_avx(auVar309,auVar249);
    auVar124 = vminps_avx(auVar113,auVar265);
    auVar274 = vminps_avx(auVar274,auVar124);
    auVar13 = vhaddps_avx(auVar13,auVar274);
    auVar73 = vmaxps_avx(auVar123,auVar73);
    auVar123 = vmaxps_avx(auVar249,auVar309);
    auVar274 = vmaxps_avx(auVar265,auVar113);
    auVar123 = vmaxps_avx(auVar274,auVar123);
    auVar73 = vhaddps_avx(auVar73,auVar123);
    auVar13 = vshufps_avx(auVar13,auVar13,0xe8);
    auVar73 = vshufps_avx(auVar73,auVar73,0xe8);
    auVar266._0_4_ = auVar176._0_4_ + auVar13._0_4_;
    auVar266._4_4_ = auVar176._4_4_ + auVar13._4_4_;
    auVar266._8_4_ = auVar176._8_4_ + auVar13._8_4_;
    auVar266._12_4_ = auVar176._12_4_ + auVar13._12_4_;
    auVar250._0_4_ = auVar176._0_4_ + auVar73._0_4_;
    auVar250._4_4_ = auVar176._4_4_ + auVar73._4_4_;
    auVar250._8_4_ = auVar176._8_4_ + auVar73._8_4_;
    auVar250._12_4_ = auVar176._12_4_ + auVar73._12_4_;
    auVar13 = vmaxps_avx(auVar282,auVar266);
    auVar73 = vminps_avx(auVar250,auVar71);
    auVar13 = vcmpps_avx(auVar73,auVar13,1);
    auVar13 = vshufps_avx(auVar13,auVar13,0x50);
    if ((auVar13 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0 || auVar13[0xf] < '\0')
    goto LAB_016b03cd;
    bVar61 = 0;
    if (auVar266._0_4_ <= fVar223) {
      auVar321 = ZEXT864(0) << 0x40;
    }
    else {
      auVar321 = ZEXT864(0) << 0x20;
      bVar61 = 0;
      if (auVar250._0_4_ < auVar71._0_4_) {
        auVar73 = vmovshdup_avx(auVar266);
        auVar13 = vcmpps_avx(auVar250,auVar71,1);
        bVar61 = auVar13[4] & auVar187._0_4_ < auVar73._0_4_;
      }
    }
    if (((3 < uVar65 || fVar97 < 0.001) | bVar61) != 1) {
      auVar12 = vinsertps_avx(auVar12,ZEXT416((uint)fVar98),0x10);
      auVar290 = ZEXT1664(auVar12);
      auVar12 = vinsertps_avx(auVar187,ZEXT416((uint)auVar205._0_4_),0x10);
      auVar321 = ZEXT1664(auVar12);
      goto LAB_016aff92;
    }
    lVar60 = 200;
    do {
      fVar138 = auVar176._0_4_;
      fVar223 = 1.0 - fVar138;
      fVar97 = fVar223 * fVar223 * fVar223;
      fVar98 = fVar138 * 3.0 * fVar223 * fVar223;
      fVar223 = fVar223 * fVar138 * fVar138 * 3.0;
      auVar163._4_4_ = fVar97;
      auVar163._0_4_ = fVar97;
      auVar163._8_4_ = fVar97;
      auVar163._12_4_ = fVar97;
      auVar133._4_4_ = fVar98;
      auVar133._0_4_ = fVar98;
      auVar133._8_4_ = fVar98;
      auVar133._12_4_ = fVar98;
      auVar114._4_4_ = fVar223;
      auVar114._0_4_ = fVar223;
      auVar114._8_4_ = fVar223;
      auVar114._12_4_ = fVar223;
      fVar138 = fVar138 * fVar138 * fVar138;
      local_5e8 = auVar18._0_4_;
      fStack_5e4 = auVar18._4_4_;
      fStack_5e0 = auVar18._8_4_;
      fStack_5dc = auVar18._12_4_;
      auVar184._0_4_ = fVar138 * local_5e8;
      auVar184._4_4_ = fVar138 * fStack_5e4;
      auVar184._8_4_ = fVar138 * fStack_5e0;
      auVar184._12_4_ = fVar138 * fStack_5dc;
      auVar12 = vfmadd231ps_fma(auVar184,auVar17,auVar114);
      auVar12 = vfmadd231ps_fma(auVar12,auVar16,auVar133);
      auVar12 = vfmadd231ps_fma(auVar12,auVar15,auVar163);
      auVar115._8_8_ = auVar12._0_8_;
      auVar115._0_8_ = auVar12._0_8_;
      auVar12 = vshufpd_avx(auVar12,auVar12,3);
      auVar13 = vshufps_avx(auVar176,auVar176,0x55);
      auVar12 = vsubps_avx(auVar12,auVar115);
      auVar13 = vfmadd213ps_fma(auVar12,auVar13,auVar115);
      fVar97 = auVar13._0_4_;
      auVar12 = vshufps_avx(auVar13,auVar13,0x55);
      auVar116._0_4_ = fVar122 * fVar97 + fVar137 * auVar12._0_4_;
      auVar116._4_4_ = auVar85._4_4_ * fVar97 + auVar72._4_4_ * auVar12._4_4_;
      auVar116._8_4_ = auVar85._8_4_ * fVar97 + auVar72._8_4_ * auVar12._8_4_;
      auVar116._12_4_ = auVar85._12_4_ * fVar97 + auVar72._12_4_ * auVar12._12_4_;
      auVar176 = vsubps_avx(auVar176,auVar116);
      auVar12 = vandps_avx(auVar312,auVar13);
      auVar13 = vshufps_avx(auVar12,auVar12,0xf5);
      auVar12 = vmaxss_avx(auVar13,auVar12);
      if (auVar12._0_4_ < fVar96) {
        local_198 = auVar176._0_4_;
        if ((0.0 <= local_198) && (local_198 <= 1.0)) {
          auVar12 = vmovshdup_avx(auVar176);
          fVar97 = auVar12._0_4_;
          if ((0.0 <= fVar97) && (fVar97 <= 1.0)) {
            auVar12 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                    ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),0x1c);
            auVar123 = vinsertps_avx(auVar12,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128[2]),
                                     0x28);
            auVar12 = vdpps_avx(auVar123,local_3e8,0x7f);
            auVar13 = vdpps_avx(auVar123,local_3f8,0x7f);
            auVar85 = vdpps_avx(auVar123,local_268,0x7f);
            auVar72 = vdpps_avx(auVar123,local_278,0x7f);
            auVar73 = vdpps_avx(auVar123,local_288,0x7f);
            auVar282 = vdpps_avx(auVar123,local_298,0x7f);
            auVar71 = vdpps_avx(auVar123,local_2a8,0x7f);
            auVar123 = vdpps_avx(auVar123,local_2b8,0x7f);
            fVar98 = 1.0 - fVar97;
            auVar12 = vfmadd231ss_fma(ZEXT416((uint)(fVar97 * auVar73._0_4_)),ZEXT416((uint)fVar98),
                                      auVar12);
            auVar13 = vfmadd231ss_fma(ZEXT416((uint)(auVar282._0_4_ * fVar97)),ZEXT416((uint)fVar98)
                                      ,auVar13);
            auVar85 = vfmadd231ss_fma(ZEXT416((uint)(auVar71._0_4_ * fVar97)),ZEXT416((uint)fVar98),
                                      auVar85);
            auVar72 = vfmadd231ss_fma(ZEXT416((uint)(fVar97 * auVar123._0_4_)),ZEXT416((uint)fVar98)
                                      ,auVar72);
            fVar122 = 1.0 - local_198;
            fVar97 = fVar122 * local_198 * local_198 * 3.0;
            fVar138 = local_198 * local_198 * local_198;
            auVar85 = vfmadd231ss_fma(ZEXT416((uint)(auVar72._0_4_ * fVar138)),ZEXT416((uint)fVar97)
                                      ,auVar85);
            fVar98 = local_198 * 3.0 * fVar122 * fVar122;
            auVar13 = vfmadd231ss_fma(auVar85,ZEXT416((uint)fVar98),auVar13);
            fVar223 = fVar122 * fVar122 * fVar122;
            auVar12 = vfmadd231ss_fma(auVar13,ZEXT416((uint)fVar223),auVar12);
            fVar137 = auVar12._0_4_;
            if ((fVar68 <= fVar137) &&
               (fVar139 = *(float *)(ray + k * 4 + 0x80), fVar137 <= fVar139)) {
              pGVar5 = (context->scene->geometries).items[uVar57].ptr;
              if ((pGVar5->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                bVar67 = false;
              }
              else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                      (bVar67 = true, pGVar5->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                local_188 = vshufps_avx(auVar176,auVar176,0x55);
                auVar233._8_4_ = 0x3f800000;
                auVar233._0_8_ = 0x3f8000003f800000;
                auVar233._12_4_ = 0x3f800000;
                auVar12 = vsubps_avx(auVar233,local_188);
                fVar70 = local_188._0_4_;
                auVar251._0_4_ = fVar70 * (float)local_428._0_4_;
                fVar204 = local_188._4_4_;
                auVar251._4_4_ = fVar204 * (float)local_428._4_4_;
                fVar168 = local_188._8_4_;
                auVar251._8_4_ = fVar168 * fStack_420;
                fVar169 = local_188._12_4_;
                auVar251._12_4_ = fVar169 * fStack_41c;
                auVar267._0_4_ = fVar70 * (float)local_438._0_4_;
                auVar267._4_4_ = fVar204 * (float)local_438._4_4_;
                auVar267._8_4_ = fVar168 * fStack_430;
                auVar267._12_4_ = fVar169 * fStack_42c;
                local_528 = auVar19._0_4_;
                fStack_524 = auVar19._4_4_;
                fStack_520 = auVar19._8_4_;
                fStack_51c = auVar19._12_4_;
                auVar277._0_4_ = fVar70 * local_528;
                auVar277._4_4_ = fVar204 * fStack_524;
                auVar277._8_4_ = fVar168 * fStack_520;
                auVar277._12_4_ = fVar169 * fStack_51c;
                local_538 = auVar209._0_4_;
                fStack_534 = auVar209._4_4_;
                fStack_530 = auVar209._8_4_;
                fStack_52c = auVar209._12_4_;
                auVar286._0_4_ = fVar70 * local_538;
                auVar286._4_4_ = fVar204 * fStack_534;
                auVar286._8_4_ = fVar168 * fStack_530;
                auVar286._12_4_ = fVar169 * fStack_52c;
                auVar13 = vfmadd231ps_fma(auVar251,auVar12,local_408);
                auVar85 = vfmadd231ps_fma(auVar267,auVar12,auVar189);
                auVar72 = vfmadd231ps_fma(auVar277,auVar12,local_418);
                auVar73 = vfmadd231ps_fma(auVar286,auVar12,auVar142);
                auVar12 = vsubps_avx(auVar85,auVar13);
                auVar13 = vsubps_avx(auVar72,auVar85);
                auVar85 = vsubps_avx(auVar73,auVar72);
                auVar278._0_4_ = auVar13._0_4_ * local_198;
                auVar278._4_4_ = auVar13._4_4_ * local_198;
                auVar278._8_4_ = auVar13._8_4_ * local_198;
                auVar278._12_4_ = auVar13._12_4_ * local_198;
                auVar202._4_4_ = fVar122;
                auVar202._0_4_ = fVar122;
                auVar202._8_4_ = fVar122;
                auVar202._12_4_ = fVar122;
                auVar12 = vfmadd231ps_fma(auVar278,auVar202,auVar12);
                auVar234._0_4_ = auVar85._0_4_ * local_198;
                auVar234._4_4_ = auVar85._4_4_ * local_198;
                auVar234._8_4_ = auVar85._8_4_ * local_198;
                auVar234._12_4_ = auVar85._12_4_ * local_198;
                auVar13 = vfmadd231ps_fma(auVar234,auVar202,auVar13);
                auVar235._0_4_ = auVar13._0_4_ * local_198;
                auVar235._4_4_ = auVar13._4_4_ * local_198;
                auVar235._8_4_ = auVar13._8_4_ * local_198;
                auVar235._12_4_ = auVar13._12_4_ * local_198;
                auVar13 = vfmadd231ps_fma(auVar235,auVar202,auVar12);
                auVar185._0_4_ = fVar138 * (float)local_338._0_4_;
                auVar185._4_4_ = fVar138 * (float)local_338._4_4_;
                auVar185._8_4_ = fVar138 * fStack_330;
                auVar185._12_4_ = fVar138 * fStack_32c;
                auVar134._4_4_ = fVar97;
                auVar134._0_4_ = fVar97;
                auVar134._8_4_ = fVar97;
                auVar134._12_4_ = fVar97;
                auVar12 = vfmadd132ps_fma(auVar134,auVar185,local_328);
                auVar164._4_4_ = fVar98;
                auVar164._0_4_ = fVar98;
                auVar164._8_4_ = fVar98;
                auVar164._12_4_ = fVar98;
                auVar12 = vfmadd132ps_fma(auVar164,auVar12,local_318);
                auVar135._0_4_ = auVar13._0_4_ * 3.0;
                auVar135._4_4_ = auVar13._4_4_ * 3.0;
                auVar135._8_4_ = auVar13._8_4_ * 3.0;
                auVar135._12_4_ = auVar13._12_4_ * 3.0;
                auVar152._4_4_ = fVar223;
                auVar152._0_4_ = fVar223;
                auVar152._8_4_ = fVar223;
                auVar152._12_4_ = fVar223;
                auVar13 = vfmadd132ps_fma(auVar152,auVar12,local_308);
                auVar12 = vshufps_avx(auVar135,auVar135,0xc9);
                auVar165._0_4_ = auVar13._0_4_ * auVar12._0_4_;
                auVar165._4_4_ = auVar13._4_4_ * auVar12._4_4_;
                auVar165._8_4_ = auVar13._8_4_ * auVar12._8_4_;
                auVar165._12_4_ = auVar13._12_4_ * auVar12._12_4_;
                auVar12 = vshufps_avx(auVar13,auVar13,0xc9);
                auVar13 = vfmsub231ps_fma(auVar165,auVar135,auVar12);
                auVar12 = vshufps_avx(auVar13,auVar13,0x55);
                local_1c8[0] = (RTCHitN)auVar12[0];
                local_1c8[1] = (RTCHitN)auVar12[1];
                local_1c8[2] = (RTCHitN)auVar12[2];
                local_1c8[3] = (RTCHitN)auVar12[3];
                local_1c8[4] = (RTCHitN)auVar12[4];
                local_1c8[5] = (RTCHitN)auVar12[5];
                local_1c8[6] = (RTCHitN)auVar12[6];
                local_1c8[7] = (RTCHitN)auVar12[7];
                local_1c8[8] = (RTCHitN)auVar12[8];
                local_1c8[9] = (RTCHitN)auVar12[9];
                local_1c8[10] = (RTCHitN)auVar12[10];
                local_1c8[0xb] = (RTCHitN)auVar12[0xb];
                local_1c8[0xc] = (RTCHitN)auVar12[0xc];
                local_1c8[0xd] = (RTCHitN)auVar12[0xd];
                local_1c8[0xe] = (RTCHitN)auVar12[0xe];
                local_1c8[0xf] = (RTCHitN)auVar12[0xf];
                local_1b8 = vshufps_avx(auVar13,auVar13,0xaa);
                local_1a8 = auVar13._0_4_;
                uStack_1a4 = local_1a8;
                uStack_1a0 = local_1a8;
                uStack_19c = local_1a8;
                fStack_194 = local_198;
                fStack_190 = local_198;
                fStack_18c = local_198;
                local_178 = CONCAT44(uStack_2f4,local_2f8);
                uStack_170 = CONCAT44(uStack_2ec,uStack_2f0);
                local_168._4_4_ = uStack_2e4;
                local_168._0_4_ = local_2e8;
                local_168._8_4_ = uStack_2e0;
                local_168._12_4_ = uStack_2dc;
                vpcmpeqd_avx2(ZEXT1632(local_168),ZEXT1632(local_168));
                uStack_154 = context->user->instID[0];
                local_158 = uStack_154;
                uStack_150 = uStack_154;
                uStack_14c = uStack_154;
                uStack_148 = context->user->instPrimID[0];
                uStack_144 = uStack_148;
                uStack_140 = uStack_148;
                uStack_13c = uStack_148;
                *(float *)(ray + k * 4 + 0x80) = fVar137;
                local_458 = *local_448;
                local_388.valid = (int *)local_458;
                local_388.geometryUserPtr = pGVar5->userPtr;
                local_388.context = context->user;
                local_388.ray = (RTCRayN *)ray;
                local_388.hit = local_1c8;
                local_388.N = 4;
                local_358._0_4_ = (int)uVar58;
                if (pGVar5->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                  (*pGVar5->occlusionFilterN)(&local_388);
                  uVar58 = (ulong)(uint)local_358._0_4_;
                  auVar321 = ZEXT1664(ZEXT816(0) << 0x40);
                }
                if (local_458 == (undefined1  [16])0x0) {
                  auVar12 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                  auVar12 = auVar12 ^ _DAT_01f7ae20;
                }
                else {
                  p_Var11 = context->args->filter;
                  if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar5->field_8).field_0x2 & 0x40) != 0))
                     )) {
                    (*p_Var11)(&local_388);
                    uVar58 = (ulong)(uint)local_358._0_4_;
                    auVar321 = ZEXT1664(ZEXT816(0) << 0x40);
                  }
                  auVar13 = vpcmpeqd_avx(local_458,_DAT_01f7aa10);
                  auVar12 = auVar13 ^ _DAT_01f7ae20;
                  auVar136._8_4_ = 0xff800000;
                  auVar136._0_8_ = 0xff800000ff800000;
                  auVar136._12_4_ = 0xff800000;
                  auVar13 = vblendvps_avx(auVar136,*(undefined1 (*) [16])(local_388.ray + 0x80),
                                          auVar13);
                  *(undefined1 (*) [16])(local_388.ray + 0x80) = auVar13;
                }
                auVar117._8_8_ = 0x100000001;
                auVar117._0_8_ = 0x100000001;
                bVar67 = (auVar117 & auVar12) != (undefined1  [16])0x0;
                if (!bVar67) {
                  *(float *)(ray + k * 4 + 0x80) = fVar139;
                }
              }
              uVar58 = CONCAT71((int7)(uVar58 >> 8),(byte)uVar58 | bVar67);
            }
          }
        }
        break;
      }
      lVar60 = lVar60 + -1;
    } while (lVar60 != 0);
  }
  goto LAB_016b0523;
}

Assistant:

static __forceinline bool occluded_n(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const Vec3fa ray_org(ray.org.x[k], ray.org.y[k], ray.org.z[k]);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray_org, primID,ray.time()[k]);
          
          if (Intersector().intersect(pre,ray,k,context,geom,primID,curve,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }